

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QGate1.cpp
# Opt level: O0

void test_qclab_qgates_QGate1<std::complex<float>>(void)

{
  allocator<std::complex<float>_> *paVar1;
  undefined1 *this;
  initializer_list<std::complex<float>_> __l;
  initializer_list<std::complex<float>_> __l_00;
  initializer_list<std::complex<float>_> __l_01;
  initializer_list<std::complex<float>_> __l_02;
  initializer_list<std::complex<float>_> __l_03;
  initializer_list<std::complex<float>_> __l_04;
  initializer_list<std::complex<float>_> __l_05;
  initializer_list<std::complex<float>_> __l_06;
  initializer_list<std::complex<float>_> __l_07;
  initializer_list<std::complex<float>_> __l_08;
  initializer_list<std::complex<float>_> __l_09;
  initializer_list<std::complex<float>_> __l_10;
  initializer_list<std::complex<float>_> __l_11;
  initializer_list<std::complex<float>_> __l_12;
  initializer_list<std::complex<float>_> __l_13;
  bool bVar2;
  char *pcVar3;
  complex<float> cVar4;
  complex<float> cVar5;
  complex<float> cVar6;
  complex<float> m01;
  complex<float> m01_00;
  complex<float> m01_01;
  complex<float> m01_02;
  complex<float> m01_03;
  complex<float> m01_04;
  complex<float> m01_05;
  complex<float> m01_06;
  char *in_R9;
  string local_1320;
  AssertHelper local_1300;
  Message local_12f8;
  SquareMatrix<std::complex<float>_> local_12f0;
  SquareMatrix<std::complex<float>_> local_12e0;
  bool local_12c9;
  undefined1 local_12c8 [8];
  AssertionResult gtest_ar__31;
  SquareMatrix<std::complex<float>_> mat3_3;
  AssertHelper local_1288;
  Message local_1280;
  SquareMatrix<std::complex<float>_> local_1278;
  bool local_1261;
  undefined1 local_1260 [8];
  AssertionResult gtest_ar__30;
  AssertHelper local_1230;
  Message local_1228;
  SquareMatrix<std::complex<float>_> local_1220;
  bool local_1209;
  undefined1 local_1208 [8];
  AssertionResult gtest_ar__29;
  SquareMatrix<std::complex<float>_> mat2_3;
  AssertHelper local_11c8;
  Message local_11c0;
  bool local_11b1;
  undefined1 local_11b0 [8];
  AssertionResult gtest_ar__28;
  complex<float> local_1198;
  complex<float> local_1190;
  complex<float> local_1188;
  undefined1 local_1180 [8];
  M check1_5;
  complex<float> local_1168;
  complex<float> local_1160;
  complex<float> local_1158;
  SquareMatrix<std::complex<float>_> local_1150;
  string local_1140;
  AssertHelper local_1120;
  Message local_1118;
  undefined1 local_1109 [9];
  AssertionResult gtest_ar__27;
  SquareMatrix<std::complex<float>_> mat1_3;
  undefined1 local_10d8 [8];
  M Ytrans_1;
  RotationY<std::complex<float>_> Y_2;
  AssertHelper local_1090;
  Message local_1088;
  SquareMatrix<std::complex<float>_> local_1080;
  SquareMatrix<std::complex<float>_> local_1070;
  bool local_1059;
  undefined1 local_1058 [8];
  AssertionResult gtest_ar__26;
  SquareMatrix<std::complex<float>_> mat3_2;
  AssertHelper local_1018;
  Message local_1010;
  SquareMatrix<std::complex<float>_> local_1008;
  bool local_ff1;
  undefined1 local_ff0 [8];
  AssertionResult gtest_ar__25;
  AssertHelper local_fc0;
  Message local_fb8;
  SquareMatrix<std::complex<float>_> local_fb0;
  bool local_f99;
  undefined1 local_f98 [8];
  AssertionResult gtest_ar__24;
  SquareMatrix<std::complex<float>_> mat2_2;
  AssertHelper local_f58;
  Message local_f50;
  bool local_f41;
  undefined1 local_f40 [8];
  AssertionResult gtest_ar__23;
  complex<float> local_f28;
  complex<float> local_f20;
  complex<float> local_f18;
  undefined1 local_f10 [8];
  M check1_4;
  complex<float> local_ef8;
  complex<float> local_ef0;
  complex<float> local_ee8;
  SquareMatrix<std::complex<float>_> local_ee0;
  string local_ed0;
  AssertHelper local_eb0;
  Message local_ea8;
  undefined1 local_e99 [9];
  AssertionResult gtest_ar__22;
  SquareMatrix<std::complex<float>_> mat1_2;
  undefined1 local_e68 [8];
  M Ytrans;
  RotationY<std::complex<float>_> Y_1;
  AssertHelper local_e20;
  Message local_e18;
  SquareMatrix<std::complex<float>_> local_e10;
  SquareMatrix<std::complex<float>_> local_e00;
  SquareMatrix<std::complex<float>_> local_df0;
  bool local_dd9;
  undefined1 local_dd8 [8];
  AssertionResult gtest_ar__21;
  SquareMatrix<std::complex<float>_> mat3_1;
  AssertHelper local_d98;
  Message local_d90;
  SquareMatrix<std::complex<float>_> local_d88;
  SquareMatrix<std::complex<float>_> local_d78;
  bool local_d61;
  undefined1 local_d60 [8];
  AssertionResult gtest_ar__20;
  AssertHelper local_d30;
  Message local_d28;
  SquareMatrix<std::complex<float>_> local_d20;
  SquareMatrix<std::complex<float>_> local_d10;
  bool local_cf9;
  undefined1 local_cf8 [8];
  AssertionResult gtest_ar__19;
  SquareMatrix<std::complex<float>_> mat2_1;
  AssertHelper local_cb8;
  Message local_cb0;
  bool local_ca1;
  undefined1 local_ca0 [8];
  AssertionResult gtest_ar__18;
  complex<float> local_c88;
  complex<float> local_c80;
  complex<float> local_c78;
  undefined1 local_c70 [8];
  M check1_3;
  complex<float> local_c58;
  complex<float> local_c50;
  complex<float> local_c48;
  SquareMatrix<std::complex<float>_> local_c40;
  string local_c30;
  AssertHelper local_c10;
  Message local_c08;
  SquareMatrix<std::complex<float>_> local_c00;
  undefined1 local_be9 [9];
  AssertionResult gtest_ar__17;
  SquareMatrix<std::complex<float>_> mat1_1;
  PauliX<std::complex<float>_> X_2;
  AssertHelper local_b98;
  Message local_b90;
  SquareMatrix<std::complex<float>_> local_b88;
  SquareMatrix<std::complex<float>_> local_b78;
  SquareMatrix<std::complex<float>_> local_b68;
  bool local_b51;
  undefined1 local_b50 [8];
  AssertionResult gtest_ar__16;
  SquareMatrix<std::complex<float>_> mat3;
  AssertHelper local_b10;
  Message local_b08;
  SquareMatrix<std::complex<float>_> local_b00;
  SquareMatrix<std::complex<float>_> local_af0;
  bool local_ad9;
  undefined1 local_ad8 [8];
  AssertionResult gtest_ar__15;
  AssertHelper local_aa8;
  Message local_aa0;
  SquareMatrix<std::complex<float>_> local_a98;
  SquareMatrix<std::complex<float>_> local_a88;
  bool local_a71;
  undefined1 local_a70 [8];
  AssertionResult gtest_ar__14;
  SquareMatrix<std::complex<float>_> mat2;
  AssertHelper local_a30;
  Message local_a28;
  bool local_a19;
  undefined1 local_a18 [8];
  AssertionResult gtest_ar__13;
  complex<float> local_a00;
  complex<float> local_9f8;
  complex<float> local_9f0;
  undefined1 local_9e8 [8];
  M check1_2;
  complex<float> local_9d0;
  complex<float> local_9c8;
  complex<float> local_9c0;
  SquareMatrix<std::complex<float>_> local_9b8;
  string local_9a8;
  AssertHelper local_988;
  Message local_980;
  SquareMatrix<std::complex<float>_> local_978;
  undefined1 local_961 [9];
  AssertionResult gtest_ar__12;
  SquareMatrix<std::complex<float>_> mat1;
  PauliX<std::complex<float>_> X_1;
  AssertHelper local_910;
  Message local_908;
  bool local_8f9;
  undefined1 local_8f8 [8];
  AssertionResult gtest_ar__11;
  string local_890;
  AssertHelper local_870;
  Message local_868;
  bool local_859;
  undefined1 local_858 [8];
  AssertionResult gtest_ar__10;
  string local_7f8;
  AssertHelper local_7d8;
  Message local_7d0;
  bool local_7c1;
  undefined1 local_7c0 [8];
  AssertionResult gtest_ar__9;
  complex<float> local_7a8;
  undefined8 uStack_7a0;
  undefined8 local_798;
  undefined8 uStack_790;
  undefined8 local_788;
  undefined8 uStack_780;
  undefined8 local_778;
  undefined8 uStack_770;
  iterator local_760;
  size_type local_758;
  undefined1 local_750 [8];
  V check3_1;
  V vec3_1;
  AssertHelper local_700;
  Message local_6f8;
  bool local_6e9;
  undefined1 local_6e8 [8];
  AssertionResult gtest_ar__8;
  string local_6a8;
  AssertHelper local_688;
  Message local_680;
  bool local_671;
  undefined1 local_670 [8];
  AssertionResult gtest_ar__7;
  complex<float> local_658;
  undefined8 uStack_650;
  undefined8 local_648;
  undefined8 uStack_640;
  iterator local_638;
  size_type local_630;
  undefined1 local_628 [8];
  V check2_1;
  V vec2_1;
  AssertHelper local_5d8;
  Message local_5d0;
  bool local_5c1;
  undefined1 local_5c0 [8];
  AssertionResult gtest_ar__6;
  complex<float> local_5a8;
  complex<float> local_5a0;
  iterator local_598;
  size_type local_590;
  undefined1 local_588 [8];
  V check1_1;
  V vec1_1;
  RotationY<std::complex<float>_> Y;
  AssertHelper local_520;
  Message local_518;
  bool local_509;
  undefined1 local_508 [8];
  AssertionResult gtest_ar__5;
  string local_4a0;
  AssertHelper local_480;
  Message local_478;
  bool local_469;
  undefined1 local_468 [8];
  AssertionResult gtest_ar__4;
  string local_408;
  AssertHelper local_3e8;
  Message local_3e0;
  bool local_3d1;
  undefined1 local_3d0 [8];
  AssertionResult gtest_ar__3;
  complex<float> local_3b8;
  undefined8 uStack_3b0;
  undefined8 local_3a8;
  undefined8 uStack_3a0;
  undefined8 local_398;
  undefined8 uStack_390;
  undefined8 local_388;
  undefined8 uStack_380;
  iterator local_370;
  size_type local_368;
  undefined1 local_360 [8];
  V check3;
  V vec3;
  AssertHelper local_310;
  Message local_308;
  bool local_2f9;
  undefined1 local_2f8 [8];
  AssertionResult gtest_ar__2;
  string local_2b8;
  AssertHelper local_298;
  Message local_290;
  bool local_281;
  undefined1 local_280 [8];
  AssertionResult gtest_ar__1;
  complex<float> local_268;
  undefined8 uStack_260;
  undefined8 local_258;
  undefined8 uStack_250;
  iterator local_240;
  size_type local_238;
  undefined1 local_230 [8];
  V check2;
  V vec2;
  AssertHelper local_1e0;
  Message local_1d8;
  bool local_1c9;
  undefined1 local_1c8 [8];
  AssertionResult gtest_ar_;
  complex<float> local_1b0;
  complex<float> local_1a8;
  iterator local_1a0;
  size_type local_198;
  undefined1 local_190 [8];
  V check1;
  V vec1;
  PauliX<std::complex<float>_> X;
  complex<float> local_148;
  undefined8 uStack_140;
  undefined8 local_138;
  undefined8 uStack_130;
  undefined8 local_128;
  undefined8 uStack_120;
  undefined8 local_118;
  undefined8 uStack_110;
  iterator local_108;
  size_type local_100;
  undefined1 local_f8 [8];
  V v3;
  complex<float> local_d8;
  undefined8 uStack_d0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  iterator local_b0;
  size_type local_a8;
  undefined1 local_a0 [8];
  V v2;
  complex<float> local_80;
  complex<float> local_78;
  iterator local_70;
  size_type local_68;
  undefined1 local_60 [8];
  V v1;
  SquareMatrix<std::complex<float>_> I3;
  undefined1 local_28 [8];
  SquareMatrix<std::complex<float>_> I2;
  SquareMatrix<std::complex<float>_> I1;
  
  qclab::dense::eye<std::complex<float>>((dense *)&I2.data_,2);
  qclab::dense::eye<std::complex<float>>((dense *)local_28,4);
  qclab::dense::eye<std::complex<float>>
            ((dense *)&v1.
                       super__Vector_base<std::complex<float>,_std::allocator<std::complex<float>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage,8);
  std::complex<float>::complex(&local_80,3.0,0.0);
  std::complex<float>::complex(&local_78,5.0,0.0);
  local_70 = &local_80;
  local_68 = 2;
  paVar1 = (allocator<std::complex<float>_> *)
           ((long)&v2.super__Vector_base<std::complex<float>,_std::allocator<std::complex<float>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage + 7);
  std::allocator<std::complex<float>_>::allocator(paVar1);
  __l_13._M_len = local_68;
  __l_13._M_array = local_70;
  std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>::vector
            ((vector<std::complex<float>,_std::allocator<std::complex<float>_>_> *)local_60,__l_13,
             paVar1);
  std::allocator<std::complex<float>_>::~allocator
            ((allocator<std::complex<float>_> *)
             ((long)&v2.
                     super__Vector_base<std::complex<float>,_std::allocator<std::complex<float>_>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  local_c8 = 0x40000000;
  uStack_c0 = 0x40e00000;
  local_d8._M_value = 0x40400000;
  uStack_d0 = 0x40a00000;
  local_b0 = &local_d8;
  local_a8 = 4;
  paVar1 = (allocator<std::complex<float>_> *)
           ((long)&v3.super__Vector_base<std::complex<float>,_std::allocator<std::complex<float>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage + 7);
  std::allocator<std::complex<float>_>::allocator(paVar1);
  __l_12._M_len = local_a8;
  __l_12._M_array = local_b0;
  std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>::vector
            ((vector<std::complex<float>,_std::allocator<std::complex<float>_>_> *)local_a0,__l_12,
             paVar1);
  std::allocator<std::complex<float>_>::~allocator
            ((allocator<std::complex<float>_> *)
             ((long)&v3.
                     super__Vector_base<std::complex<float>,_std::allocator<std::complex<float>_>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  local_118 = 0x41000000;
  uStack_110 = 0x40400000;
  local_128 = 0x40800000;
  uStack_120 = 0x3f800000;
  local_138 = 0x40000000;
  uStack_130 = 0x40e00000;
  local_148._M_value = 0x40400000;
  uStack_140 = 0x40a00000;
  local_108 = &local_148;
  local_100 = 8;
  this = &X.super_QGate1<std::complex<float>_>.field_0xf;
  std::allocator<std::complex<float>_>::allocator((allocator<std::complex<float>_> *)this);
  __l_11._M_len = local_100;
  __l_11._M_array = local_108;
  std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>::vector
            ((vector<std::complex<float>,_std::allocator<std::complex<float>_>_> *)local_f8,__l_11,
             (allocator_type *)this);
  std::allocator<std::complex<float>_>::~allocator
            ((allocator<std::complex<float>_> *)&X.super_QGate1<std::complex<float>_>.field_0xf);
  qclab::qgates::PauliX<std::complex<float>_>::PauliX
            ((PauliX<std::complex<float>_> *)
             &vec1.super__Vector_base<std::complex<float>,_std::allocator<std::complex<float>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,0);
  std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>::vector
            ((vector<std::complex<float>,_std::allocator<std::complex<float>_>_> *)
             &check1.super__Vector_base<std::complex<float>,_std::allocator<std::complex<float>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,
             (vector<std::complex<float>,_std::allocator<std::complex<float>_>_> *)local_60);
  qclab::qgates::PauliX<std::complex<float>_>::apply
            ((PauliX<std::complex<float>_> *)
             &vec1.super__Vector_base<std::complex<float>,_std::allocator<std::complex<float>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,NoTrans,1,
             (vector<std::complex<float>,_std::allocator<std::complex<float>_>_> *)
             &check1.super__Vector_base<std::complex<float>,_std::allocator<std::complex<float>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,0);
  std::complex<float>::complex(&local_1b0,5.0,0.0);
  std::complex<float>::complex(&local_1a8,3.0,0.0);
  local_1a0 = &local_1b0;
  local_198 = 2;
  paVar1 = (allocator<std::complex<float>_> *)
           ((long)&gtest_ar_.message_._M_t.
                   super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   .
                   super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
           + 7);
  std::allocator<std::complex<float>_>::allocator(paVar1);
  __l_10._M_len = local_198;
  __l_10._M_array = local_1a0;
  std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>::vector
            ((vector<std::complex<float>,_std::allocator<std::complex<float>_>_> *)local_190,__l_10,
             paVar1);
  std::allocator<std::complex<float>_>::~allocator
            ((allocator<std::complex<float>_> *)
             ((long)&gtest_ar_.message_._M_t.
                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             + 7));
  local_1c9 = std::operator==((vector<std::complex<float>,_std::allocator<std::complex<float>_>_> *)
                              &check1.
                               super__Vector_base<std::complex<float>,_std::allocator<std::complex<float>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage,
                              (vector<std::complex<float>,_std::allocator<std::complex<float>_>_> *)
                              local_190);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_1c8,&local_1c9,(type *)0x0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1c8);
  if (!bVar2) {
    testing::Message::Message(&local_1d8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)
               &vec2.super__Vector_base<std::complex<float>,_std::allocator<std::complex<float>_>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage,(internal *)local_1c8,
               (AssertionResult *)"vec1 == check1","false","true",in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_1e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/QGate1.cpp"
               ,0x1d,pcVar3);
    testing::internal::AssertHelper::operator=(&local_1e0,&local_1d8);
    testing::internal::AssertHelper::~AssertHelper(&local_1e0);
    std::__cxx11::string::~string
              ((string *)
               &vec2.super__Vector_base<std::complex<float>,_std::allocator<std::complex<float>_>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage);
    testing::Message::~Message(&local_1d8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1c8);
  std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>::vector
            ((vector<std::complex<float>,_std::allocator<std::complex<float>_>_> *)
             &check2.super__Vector_base<std::complex<float>,_std::allocator<std::complex<float>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,
             (vector<std::complex<float>,_std::allocator<std::complex<float>_>_> *)local_a0);
  qclab::qgates::PauliX<std::complex<float>_>::apply
            ((PauliX<std::complex<float>_> *)
             &vec1.super__Vector_base<std::complex<float>,_std::allocator<std::complex<float>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,NoTrans,2,
             (vector<std::complex<float>,_std::allocator<std::complex<float>_>_> *)
             &check2.super__Vector_base<std::complex<float>,_std::allocator<std::complex<float>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,0);
  local_258 = 0x40400000;
  uStack_250 = 0x40a00000;
  local_268._M_value = 0x40000000;
  uStack_260 = 0x40e00000;
  local_240 = &local_268;
  local_238 = 4;
  paVar1 = (allocator<std::complex<float>_> *)
           ((long)&gtest_ar__1.message_._M_t.
                   super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   .
                   super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
           + 7);
  std::allocator<std::complex<float>_>::allocator(paVar1);
  __l_09._M_len = local_238;
  __l_09._M_array = local_240;
  std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>::vector
            ((vector<std::complex<float>,_std::allocator<std::complex<float>_>_> *)local_230,__l_09,
             paVar1);
  std::allocator<std::complex<float>_>::~allocator
            ((allocator<std::complex<float>_> *)
             ((long)&gtest_ar__1.message_._M_t.
                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             + 7));
  local_281 = std::operator==((vector<std::complex<float>,_std::allocator<std::complex<float>_>_> *)
                              &check2.
                               super__Vector_base<std::complex<float>,_std::allocator<std::complex<float>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage,
                              (vector<std::complex<float>,_std::allocator<std::complex<float>_>_> *)
                              local_230);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_280,&local_281,(type *)0x0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_280);
  if (!bVar2) {
    testing::Message::Message(&local_290);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_2b8,(internal *)local_280,(AssertionResult *)"vec2 == check2","false","true",
               in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_298,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/QGate1.cpp"
               ,0x29,pcVar3);
    testing::internal::AssertHelper::operator=(&local_298,&local_290);
    testing::internal::AssertHelper::~AssertHelper(&local_298);
    std::__cxx11::string::~string((string *)&local_2b8);
    testing::Message::~Message(&local_290);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_280);
  qclab::qgates::QGate1<std::complex<float>_>::setQubit
            ((QGate1<std::complex<float>_> *)
             &vec1.super__Vector_base<std::complex<float>,_std::allocator<std::complex<float>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,1);
  std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>::operator=
            ((vector<std::complex<float>,_std::allocator<std::complex<float>_>_> *)
             &check2.super__Vector_base<std::complex<float>,_std::allocator<std::complex<float>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,
             (vector<std::complex<float>,_std::allocator<std::complex<float>_>_> *)local_a0);
  qclab::qgates::PauliX<std::complex<float>_>::apply
            ((PauliX<std::complex<float>_> *)
             &vec1.super__Vector_base<std::complex<float>,_std::allocator<std::complex<float>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,NoTrans,2,
             (vector<std::complex<float>,_std::allocator<std::complex<float>_>_> *)
             &check2.super__Vector_base<std::complex<float>,_std::allocator<std::complex<float>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,0);
  gtest_ar__2.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x40a00000;
  __l_08._M_len = 4;
  __l_08._M_array = (iterator)&gtest_ar__2.message_;
  std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>::operator=
            ((vector<std::complex<float>,_std::allocator<std::complex<float>_>_> *)local_230,__l_08)
  ;
  local_2f9 = std::operator==((vector<std::complex<float>,_std::allocator<std::complex<float>_>_> *)
                              &check2.
                               super__Vector_base<std::complex<float>,_std::allocator<std::complex<float>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage,
                              (vector<std::complex<float>,_std::allocator<std::complex<float>_>_> *)
                              local_230);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_2f8,&local_2f9,(type *)0x0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2f8);
  if (!bVar2) {
    testing::Message::Message(&local_308);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)
               &vec3.super__Vector_base<std::complex<float>,_std::allocator<std::complex<float>_>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage,(internal *)local_2f8,
               (AssertionResult *)"vec2 == check2","false","true",in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_310,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/QGate1.cpp"
               ,0x35,pcVar3);
    testing::internal::AssertHelper::operator=(&local_310,&local_308);
    testing::internal::AssertHelper::~AssertHelper(&local_310);
    std::__cxx11::string::~string
              ((string *)
               &vec3.super__Vector_base<std::complex<float>,_std::allocator<std::complex<float>_>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage);
    testing::Message::~Message(&local_308);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2f8);
  std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>::vector
            ((vector<std::complex<float>,_std::allocator<std::complex<float>_>_> *)
             &check3.super__Vector_base<std::complex<float>,_std::allocator<std::complex<float>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,
             (vector<std::complex<float>,_std::allocator<std::complex<float>_>_> *)local_f8);
  qclab::qgates::PauliX<std::complex<float>_>::apply
            ((PauliX<std::complex<float>_> *)
             &vec1.super__Vector_base<std::complex<float>,_std::allocator<std::complex<float>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,NoTrans,3,
             (vector<std::complex<float>,_std::allocator<std::complex<float>_>_> *)
             &check3.super__Vector_base<std::complex<float>,_std::allocator<std::complex<float>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,0);
  local_388 = 0x40800000;
  uStack_380 = 0x3f800000;
  local_398 = 0x41000000;
  uStack_390 = 0x40400000;
  local_3a8 = 0x40400000;
  uStack_3a0 = 0x40a00000;
  local_3b8._M_value = 0x40000000;
  uStack_3b0 = 0x40e00000;
  local_370 = &local_3b8;
  local_368 = 8;
  paVar1 = (allocator<std::complex<float>_> *)
           ((long)&gtest_ar__3.message_._M_t.
                   super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   .
                   super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
           + 7);
  std::allocator<std::complex<float>_>::allocator(paVar1);
  __l_07._M_len = local_368;
  __l_07._M_array = local_370;
  std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>::vector
            ((vector<std::complex<float>,_std::allocator<std::complex<float>_>_> *)local_360,__l_07,
             paVar1);
  std::allocator<std::complex<float>_>::~allocator
            ((allocator<std::complex<float>_> *)
             ((long)&gtest_ar__3.message_._M_t.
                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             + 7));
  local_3d1 = std::operator==((vector<std::complex<float>,_std::allocator<std::complex<float>_>_> *)
                              &check3.
                               super__Vector_base<std::complex<float>,_std::allocator<std::complex<float>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage,
                              (vector<std::complex<float>,_std::allocator<std::complex<float>_>_> *)
                              local_360);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_3d0,&local_3d1,(type *)0x0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3d0);
  if (!bVar2) {
    testing::Message::Message(&local_3e0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_408,(internal *)local_3d0,(AssertionResult *)"vec3 == check3","false","true",
               in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_3e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/QGate1.cpp"
               ,0x41,pcVar3);
    testing::internal::AssertHelper::operator=(&local_3e8,&local_3e0);
    testing::internal::AssertHelper::~AssertHelper(&local_3e8);
    std::__cxx11::string::~string((string *)&local_408);
    testing::Message::~Message(&local_3e0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_3d0);
  qclab::qgates::QGate1<std::complex<float>_>::setQubit
            ((QGate1<std::complex<float>_> *)
             &vec1.super__Vector_base<std::complex<float>,_std::allocator<std::complex<float>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,0);
  std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>::operator=
            ((vector<std::complex<float>,_std::allocator<std::complex<float>_>_> *)
             &check3.super__Vector_base<std::complex<float>,_std::allocator<std::complex<float>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,
             (vector<std::complex<float>,_std::allocator<std::complex<float>_>_> *)local_f8);
  qclab::qgates::PauliX<std::complex<float>_>::apply
            ((PauliX<std::complex<float>_> *)
             &vec1.super__Vector_base<std::complex<float>,_std::allocator<std::complex<float>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,NoTrans,3,
             (vector<std::complex<float>,_std::allocator<std::complex<float>_>_> *)
             &check3.super__Vector_base<std::complex<float>,_std::allocator<std::complex<float>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,0);
  gtest_ar__4.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x40800000;
  __l_06._M_len = 8;
  __l_06._M_array = (iterator)&gtest_ar__4.message_;
  std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>::operator=
            ((vector<std::complex<float>,_std::allocator<std::complex<float>_>_> *)local_360,__l_06)
  ;
  local_469 = std::operator==((vector<std::complex<float>,_std::allocator<std::complex<float>_>_> *)
                              &check3.
                               super__Vector_base<std::complex<float>,_std::allocator<std::complex<float>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage,
                              (vector<std::complex<float>,_std::allocator<std::complex<float>_>_> *)
                              local_360);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_468,&local_469,(type *)0x0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_468);
  if (!bVar2) {
    testing::Message::Message(&local_478);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_4a0,(internal *)local_468,(AssertionResult *)"vec3 == check3","false","true",
               in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_480,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/QGate1.cpp"
               ,0x4d,pcVar3);
    testing::internal::AssertHelper::operator=(&local_480,&local_478);
    testing::internal::AssertHelper::~AssertHelper(&local_480);
    std::__cxx11::string::~string((string *)&local_4a0);
    testing::Message::~Message(&local_478);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_468);
  qclab::qgates::QGate1<std::complex<float>_>::setQubit
            ((QGate1<std::complex<float>_> *)
             &vec1.super__Vector_base<std::complex<float>,_std::allocator<std::complex<float>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,2);
  std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>::operator=
            ((vector<std::complex<float>,_std::allocator<std::complex<float>_>_> *)
             &check3.super__Vector_base<std::complex<float>,_std::allocator<std::complex<float>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,
             (vector<std::complex<float>,_std::allocator<std::complex<float>_>_> *)local_f8);
  qclab::qgates::PauliX<std::complex<float>_>::apply
            ((PauliX<std::complex<float>_> *)
             &vec1.super__Vector_base<std::complex<float>,_std::allocator<std::complex<float>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,NoTrans,3,
             (vector<std::complex<float>,_std::allocator<std::complex<float>_>_> *)
             &check3.super__Vector_base<std::complex<float>,_std::allocator<std::complex<float>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,0);
  gtest_ar__5.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x40a00000;
  __l_05._M_len = 8;
  __l_05._M_array = (iterator)&gtest_ar__5.message_;
  std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>::operator=
            ((vector<std::complex<float>,_std::allocator<std::complex<float>_>_> *)local_360,__l_05)
  ;
  local_509 = std::operator==((vector<std::complex<float>,_std::allocator<std::complex<float>_>_> *)
                              &check3.
                               super__Vector_base<std::complex<float>,_std::allocator<std::complex<float>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage,
                              (vector<std::complex<float>,_std::allocator<std::complex<float>_>_> *)
                              local_360);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_508,&local_509,(type *)0x0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_508);
  if (!bVar2) {
    testing::Message::Message(&local_518);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&Y.super_QRotationGate1<std::complex<float>_>.rotation_,
               (internal *)local_508,(AssertionResult *)"vec3 == check3","false","true",in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_520,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/QGate1.cpp"
               ,0x59,pcVar3);
    testing::internal::AssertHelper::operator=(&local_520,&local_518);
    testing::internal::AssertHelper::~AssertHelper(&local_520);
    std::__cxx11::string::~string((string *)&Y.super_QRotationGate1<std::complex<float>_>.rotation_)
    ;
    testing::Message::~Message(&local_518);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_508);
  std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>::~vector
            ((vector<std::complex<float>,_std::allocator<std::complex<float>_>_> *)local_360);
  std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>::~vector
            ((vector<std::complex<float>,_std::allocator<std::complex<float>_>_> *)
             &check3.super__Vector_base<std::complex<float>,_std::allocator<std::complex<float>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>::~vector
            ((vector<std::complex<float>,_std::allocator<std::complex<float>_>_> *)local_230);
  std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>::~vector
            ((vector<std::complex<float>,_std::allocator<std::complex<float>_>_> *)
             &check2.super__Vector_base<std::complex<float>,_std::allocator<std::complex<float>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>::~vector
            ((vector<std::complex<float>,_std::allocator<std::complex<float>_>_> *)local_190);
  std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>::~vector
            ((vector<std::complex<float>,_std::allocator<std::complex<float>_>_> *)
             &check1.super__Vector_base<std::complex<float>,_std::allocator<std::complex<float>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  qclab::qgates::PauliX<std::complex<float>_>::~PauliX
            ((PauliX<std::complex<float>_> *)
             &vec1.super__Vector_base<std::complex<float>,_std::allocator<std::complex<float>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  qclab::qgates::RotationY<std::complex<float>_>::RotationY
            ((RotationY<std::complex<float>_> *)
             &vec1_1.super__Vector_base<std::complex<float>,_std::allocator<std::complex<float>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,0,0.0,1.0,false);
  std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>::vector
            ((vector<std::complex<float>,_std::allocator<std::complex<float>_>_> *)
             &check1_1.
              super__Vector_base<std::complex<float>,_std::allocator<std::complex<float>_>_>._M_impl
              .super__Vector_impl_data._M_end_of_storage,
             (vector<std::complex<float>,_std::allocator<std::complex<float>_>_> *)local_60);
  qclab::qgates::RotationY<std::complex<float>_>::apply
            ((RotationY<std::complex<float>_> *)
             &vec1_1.super__Vector_base<std::complex<float>,_std::allocator<std::complex<float>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,Trans,1,
             (vector<std::complex<float>,_std::allocator<std::complex<float>_>_> *)
             &check1_1.
              super__Vector_base<std::complex<float>,_std::allocator<std::complex<float>_>_>._M_impl
              .super__Vector_impl_data._M_end_of_storage,0);
  std::complex<float>::complex(&local_5a8,5.0,0.0);
  std::complex<float>::complex(&local_5a0,-3.0,0.0);
  local_598 = &local_5a8;
  local_590 = 2;
  paVar1 = (allocator<std::complex<float>_> *)
           ((long)&gtest_ar__6.message_._M_t.
                   super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   .
                   super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
           + 7);
  std::allocator<std::complex<float>_>::allocator(paVar1);
  __l_04._M_len = local_590;
  __l_04._M_array = local_598;
  std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>::vector
            ((vector<std::complex<float>,_std::allocator<std::complex<float>_>_> *)local_588,__l_04,
             paVar1);
  std::allocator<std::complex<float>_>::~allocator
            ((allocator<std::complex<float>_> *)
             ((long)&gtest_ar__6.message_._M_t.
                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             + 7));
  local_5c1 = std::operator==((vector<std::complex<float>,_std::allocator<std::complex<float>_>_> *)
                              &check1_1.
                               super__Vector_base<std::complex<float>,_std::allocator<std::complex<float>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage,
                              (vector<std::complex<float>,_std::allocator<std::complex<float>_>_> *)
                              local_588);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_5c0,&local_5c1,(type *)0x0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_5c0);
  if (!bVar2) {
    testing::Message::Message(&local_5d0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)
               &vec2_1.
                super__Vector_base<std::complex<float>,_std::allocator<std::complex<float>_>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage,(internal *)local_5c0,
               (AssertionResult *)"vec1 == check1","false","true",in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_5d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/QGate1.cpp"
               ,0x6a,pcVar3);
    testing::internal::AssertHelper::operator=(&local_5d8,&local_5d0);
    testing::internal::AssertHelper::~AssertHelper(&local_5d8);
    std::__cxx11::string::~string
              ((string *)
               &vec2_1.
                super__Vector_base<std::complex<float>,_std::allocator<std::complex<float>_>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage);
    testing::Message::~Message(&local_5d0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_5c0);
  std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>::vector
            ((vector<std::complex<float>,_std::allocator<std::complex<float>_>_> *)
             &check2_1.
              super__Vector_base<std::complex<float>,_std::allocator<std::complex<float>_>_>._M_impl
              .super__Vector_impl_data._M_end_of_storage,
             (vector<std::complex<float>,_std::allocator<std::complex<float>_>_> *)local_a0);
  qclab::qgates::RotationY<std::complex<float>_>::apply
            ((RotationY<std::complex<float>_> *)
             &vec1_1.super__Vector_base<std::complex<float>,_std::allocator<std::complex<float>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,Trans,2,
             (vector<std::complex<float>,_std::allocator<std::complex<float>_>_> *)
             &check2_1.
              super__Vector_base<std::complex<float>,_std::allocator<std::complex<float>_>_>._M_impl
              .super__Vector_impl_data._M_end_of_storage,0);
  local_648 = 0xc0400000;
  uStack_640 = 0xc0a00000;
  local_658._M_value = 0x40000000;
  uStack_650 = 0x40e00000;
  local_638 = &local_658;
  local_630 = 4;
  paVar1 = (allocator<std::complex<float>_> *)
           ((long)&gtest_ar__7.message_._M_t.
                   super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   .
                   super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
           + 7);
  std::allocator<std::complex<float>_>::allocator(paVar1);
  __l_03._M_len = local_630;
  __l_03._M_array = local_638;
  std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>::vector
            ((vector<std::complex<float>,_std::allocator<std::complex<float>_>_> *)local_628,__l_03,
             paVar1);
  std::allocator<std::complex<float>_>::~allocator
            ((allocator<std::complex<float>_> *)
             ((long)&gtest_ar__7.message_._M_t.
                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             + 7));
  local_671 = std::operator==((vector<std::complex<float>,_std::allocator<std::complex<float>_>_> *)
                              &check2_1.
                               super__Vector_base<std::complex<float>,_std::allocator<std::complex<float>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage,
                              (vector<std::complex<float>,_std::allocator<std::complex<float>_>_> *)
                              local_628);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_670,&local_671,(type *)0x0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_670);
  if (!bVar2) {
    testing::Message::Message(&local_680);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_6a8,(internal *)local_670,(AssertionResult *)"vec2 == check2","false","true",
               in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_688,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/QGate1.cpp"
               ,0x76,pcVar3);
    testing::internal::AssertHelper::operator=(&local_688,&local_680);
    testing::internal::AssertHelper::~AssertHelper(&local_688);
    std::__cxx11::string::~string((string *)&local_6a8);
    testing::Message::~Message(&local_680);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_670);
  qclab::qgates::QGate1<std::complex<float>_>::setQubit
            ((QGate1<std::complex<float>_> *)
             &vec1_1.super__Vector_base<std::complex<float>,_std::allocator<std::complex<float>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,1);
  std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>::operator=
            ((vector<std::complex<float>,_std::allocator<std::complex<float>_>_> *)
             &check2_1.
              super__Vector_base<std::complex<float>,_std::allocator<std::complex<float>_>_>._M_impl
              .super__Vector_impl_data._M_end_of_storage,
             (vector<std::complex<float>,_std::allocator<std::complex<float>_>_> *)local_a0);
  qclab::qgates::RotationY<std::complex<float>_>::apply
            ((RotationY<std::complex<float>_> *)
             &vec1_1.super__Vector_base<std::complex<float>,_std::allocator<std::complex<float>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,Trans,2,
             (vector<std::complex<float>,_std::allocator<std::complex<float>_>_> *)
             &check2_1.
              super__Vector_base<std::complex<float>,_std::allocator<std::complex<float>_>_>._M_impl
              .super__Vector_impl_data._M_end_of_storage,0);
  gtest_ar__8.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x40a00000;
  __l_02._M_len = 4;
  __l_02._M_array = (iterator)&gtest_ar__8.message_;
  std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>::operator=
            ((vector<std::complex<float>,_std::allocator<std::complex<float>_>_> *)local_628,__l_02)
  ;
  local_6e9 = std::operator==((vector<std::complex<float>,_std::allocator<std::complex<float>_>_> *)
                              &check2_1.
                               super__Vector_base<std::complex<float>,_std::allocator<std::complex<float>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage,
                              (vector<std::complex<float>,_std::allocator<std::complex<float>_>_> *)
                              local_628);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_6e8,&local_6e9,(type *)0x0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_6e8);
  if (!bVar2) {
    testing::Message::Message(&local_6f8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)
               &vec3_1.
                super__Vector_base<std::complex<float>,_std::allocator<std::complex<float>_>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage,(internal *)local_6e8,
               (AssertionResult *)"vec2 == check2","false","true",in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_700,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/QGate1.cpp"
               ,0x82,pcVar3);
    testing::internal::AssertHelper::operator=(&local_700,&local_6f8);
    testing::internal::AssertHelper::~AssertHelper(&local_700);
    std::__cxx11::string::~string
              ((string *)
               &vec3_1.
                super__Vector_base<std::complex<float>,_std::allocator<std::complex<float>_>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage);
    testing::Message::~Message(&local_6f8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_6e8);
  std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>::vector
            ((vector<std::complex<float>,_std::allocator<std::complex<float>_>_> *)
             &check3_1.
              super__Vector_base<std::complex<float>,_std::allocator<std::complex<float>_>_>._M_impl
              .super__Vector_impl_data._M_end_of_storage,
             (vector<std::complex<float>,_std::allocator<std::complex<float>_>_> *)local_f8);
  qclab::qgates::RotationY<std::complex<float>_>::apply
            ((RotationY<std::complex<float>_> *)
             &vec1_1.super__Vector_base<std::complex<float>,_std::allocator<std::complex<float>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,Trans,3,
             (vector<std::complex<float>,_std::allocator<std::complex<float>_>_> *)
             &check3_1.
              super__Vector_base<std::complex<float>,_std::allocator<std::complex<float>_>_>._M_impl
              .super__Vector_impl_data._M_end_of_storage,0);
  local_778 = 0xc0800000;
  uStack_770 = 0xbf800000;
  local_788 = 0x41000000;
  uStack_780 = 0x40400000;
  local_798 = 0xc0400000;
  uStack_790 = 0xc0a00000;
  local_7a8._M_value = 0x40000000;
  uStack_7a0 = 0x40e00000;
  local_760 = &local_7a8;
  local_758 = 8;
  paVar1 = (allocator<std::complex<float>_> *)
           ((long)&gtest_ar__9.message_._M_t.
                   super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   .
                   super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
           + 7);
  std::allocator<std::complex<float>_>::allocator(paVar1);
  __l_01._M_len = local_758;
  __l_01._M_array = local_760;
  std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>::vector
            ((vector<std::complex<float>,_std::allocator<std::complex<float>_>_> *)local_750,__l_01,
             paVar1);
  std::allocator<std::complex<float>_>::~allocator
            ((allocator<std::complex<float>_> *)
             ((long)&gtest_ar__9.message_._M_t.
                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             + 7));
  local_7c1 = std::operator==((vector<std::complex<float>,_std::allocator<std::complex<float>_>_> *)
                              &check3_1.
                               super__Vector_base<std::complex<float>,_std::allocator<std::complex<float>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage,
                              (vector<std::complex<float>,_std::allocator<std::complex<float>_>_> *)
                              local_750);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_7c0,&local_7c1,(type *)0x0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_7c0);
  if (!bVar2) {
    testing::Message::Message(&local_7d0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_7f8,(internal *)local_7c0,(AssertionResult *)"vec3 == check3","false","true",
               in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_7d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/QGate1.cpp"
               ,0x8e,pcVar3);
    testing::internal::AssertHelper::operator=(&local_7d8,&local_7d0);
    testing::internal::AssertHelper::~AssertHelper(&local_7d8);
    std::__cxx11::string::~string((string *)&local_7f8);
    testing::Message::~Message(&local_7d0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_7c0);
  qclab::qgates::QGate1<std::complex<float>_>::setQubit
            ((QGate1<std::complex<float>_> *)
             &vec1_1.super__Vector_base<std::complex<float>,_std::allocator<std::complex<float>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,0);
  std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>::operator=
            ((vector<std::complex<float>,_std::allocator<std::complex<float>_>_> *)
             &check3_1.
              super__Vector_base<std::complex<float>,_std::allocator<std::complex<float>_>_>._M_impl
              .super__Vector_impl_data._M_end_of_storage,
             (vector<std::complex<float>,_std::allocator<std::complex<float>_>_> *)local_f8);
  qclab::qgates::RotationY<std::complex<float>_>::apply
            ((RotationY<std::complex<float>_> *)
             &vec1_1.super__Vector_base<std::complex<float>,_std::allocator<std::complex<float>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,Trans,3,
             (vector<std::complex<float>,_std::allocator<std::complex<float>_>_> *)
             &check3_1.
              super__Vector_base<std::complex<float>,_std::allocator<std::complex<float>_>_>._M_impl
              .super__Vector_impl_data._M_end_of_storage,0);
  gtest_ar__10.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x40800000;
  __l_00._M_len = 8;
  __l_00._M_array = (iterator)&gtest_ar__10.message_;
  std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>::operator=
            ((vector<std::complex<float>,_std::allocator<std::complex<float>_>_> *)local_750,__l_00)
  ;
  local_859 = std::operator==((vector<std::complex<float>,_std::allocator<std::complex<float>_>_> *)
                              &check3_1.
                               super__Vector_base<std::complex<float>,_std::allocator<std::complex<float>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage,
                              (vector<std::complex<float>,_std::allocator<std::complex<float>_>_> *)
                              local_750);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_858,&local_859,(type *)0x0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_858);
  if (!bVar2) {
    testing::Message::Message(&local_868);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_890,(internal *)local_858,(AssertionResult *)"vec3 == check3","false","true",
               in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_870,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/QGate1.cpp"
               ,0x9a,pcVar3);
    testing::internal::AssertHelper::operator=(&local_870,&local_868);
    testing::internal::AssertHelper::~AssertHelper(&local_870);
    std::__cxx11::string::~string((string *)&local_890);
    testing::Message::~Message(&local_868);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_858);
  qclab::qgates::QGate1<std::complex<float>_>::setQubit
            ((QGate1<std::complex<float>_> *)
             &vec1_1.super__Vector_base<std::complex<float>,_std::allocator<std::complex<float>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,2);
  std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>::operator=
            ((vector<std::complex<float>,_std::allocator<std::complex<float>_>_> *)
             &check3_1.
              super__Vector_base<std::complex<float>,_std::allocator<std::complex<float>_>_>._M_impl
              .super__Vector_impl_data._M_end_of_storage,
             (vector<std::complex<float>,_std::allocator<std::complex<float>_>_> *)local_f8);
  qclab::qgates::RotationY<std::complex<float>_>::apply
            ((RotationY<std::complex<float>_> *)
             &vec1_1.super__Vector_base<std::complex<float>,_std::allocator<std::complex<float>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,Trans,3,
             (vector<std::complex<float>,_std::allocator<std::complex<float>_>_> *)
             &check3_1.
              super__Vector_base<std::complex<float>,_std::allocator<std::complex<float>_>_>._M_impl
              .super__Vector_impl_data._M_end_of_storage,0);
  gtest_ar__11.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x40a00000;
  __l._M_len = 8;
  __l._M_array = (iterator)&gtest_ar__11.message_;
  std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>::operator=
            ((vector<std::complex<float>,_std::allocator<std::complex<float>_>_> *)local_750,__l);
  local_8f9 = std::operator==((vector<std::complex<float>,_std::allocator<std::complex<float>_>_> *)
                              &check3_1.
                               super__Vector_base<std::complex<float>,_std::allocator<std::complex<float>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage,
                              (vector<std::complex<float>,_std::allocator<std::complex<float>_>_> *)
                              local_750);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_8f8,&local_8f9,(type *)0x0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_8f8);
  if (!bVar2) {
    testing::Message::Message(&local_908);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&X_1.super_QGate1<std::complex<float>_>.qubit_,(internal *)local_8f8,
               (AssertionResult *)"vec3 == check3","false","true",in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_910,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/QGate1.cpp"
               ,0xa6,pcVar3);
    testing::internal::AssertHelper::operator=(&local_910,&local_908);
    testing::internal::AssertHelper::~AssertHelper(&local_910);
    std::__cxx11::string::~string((string *)&X_1.super_QGate1<std::complex<float>_>.qubit_);
    testing::Message::~Message(&local_908);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_8f8);
  std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>::~vector
            ((vector<std::complex<float>,_std::allocator<std::complex<float>_>_> *)local_750);
  std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>::~vector
            ((vector<std::complex<float>,_std::allocator<std::complex<float>_>_> *)
             &check3_1.
              super__Vector_base<std::complex<float>,_std::allocator<std::complex<float>_>_>._M_impl
              .super__Vector_impl_data._M_end_of_storage);
  std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>::~vector
            ((vector<std::complex<float>,_std::allocator<std::complex<float>_>_> *)local_628);
  std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>::~vector
            ((vector<std::complex<float>,_std::allocator<std::complex<float>_>_> *)
             &check2_1.
              super__Vector_base<std::complex<float>,_std::allocator<std::complex<float>_>_>._M_impl
              .super__Vector_impl_data._M_end_of_storage);
  std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>::~vector
            ((vector<std::complex<float>,_std::allocator<std::complex<float>_>_> *)local_588);
  std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>::~vector
            ((vector<std::complex<float>,_std::allocator<std::complex<float>_>_> *)
             &check1_1.
              super__Vector_base<std::complex<float>,_std::allocator<std::complex<float>_>_>._M_impl
              .super__Vector_impl_data._M_end_of_storage);
  qclab::qgates::RotationY<std::complex<float>_>::~RotationY
            ((RotationY<std::complex<float>_> *)
             &vec1_1.super__Vector_base<std::complex<float>,_std::allocator<std::complex<float>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  qclab::qgates::PauliX<std::complex<float>_>::PauliX((PauliX<std::complex<float>_> *)&mat1.data_,0)
  ;
  qclab::dense::SquareMatrix<std::complex<float>_>::SquareMatrix
            ((SquareMatrix<std::complex<float>_> *)&gtest_ar__12.message_,
             (SquareMatrix<std::complex<float>_> *)&I2.data_);
  cVar5._M_value = 1;
  cVar4._M_value = (_ComplexT)&gtest_ar__12.message_;
  pcVar3 = (char *)0x0;
  qclab::qgates::PauliX<std::complex<float>_>::apply
            ((PauliX<std::complex<float>_> *)&mat1.data_,Left,NoTrans,1,
             (SquareMatrix<std::complex<float>_> *)cVar4._M_value,0);
  qclab::qgates::PauliX<std::complex<float>_>::matrix((PauliX<std::complex<float>_> *)&local_978);
  local_961[0] = qclab::dense::SquareMatrix<std::complex<float>_>::operator==
                           ((SquareMatrix<std::complex<float>_> *)&gtest_ar__12.message_,&local_978)
  ;
  cVar6._M_value = (_ComplexT)local_961;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)(local_961 + 1),(bool *)cVar6._M_value,(type *)0x0);
  qclab::dense::SquareMatrix<std::complex<float>_>::~SquareMatrix(&local_978);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)(local_961 + 1));
  if (!bVar2) {
    testing::Message::Message(&local_980);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_9a8,(internal *)(local_961 + 1),(AssertionResult *)"mat1 == X.matrix()",
               "false","true",pcVar3);
    cVar4._M_value = std::__cxx11::string::c_str();
    cVar5._M_value = 0xb7;
    testing::internal::AssertHelper::AssertHelper
              (&local_988,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/QGate1.cpp"
               ,0xb7,(char *)cVar4._M_value);
    cVar6._M_value = (_ComplexT)&local_980;
    testing::internal::AssertHelper::operator=(&local_988,(Message *)cVar6._M_value);
    testing::internal::AssertHelper::~AssertHelper(&local_988);
    std::__cxx11::string::~string((string *)&local_9a8);
    testing::Message::~Message(&local_980);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)(local_961 + 1));
  std::complex<float>::complex(&local_9c0,2.0,0.0);
  std::complex<float>::complex(&local_9c8,3.0,0.0);
  std::complex<float>::complex(&local_9d0,5.0,0.0);
  std::complex<float>::complex((complex<float> *)&check1_2.data_,7.0,0.0);
  qclab::dense::SquareMatrix<std::complex<float>_>::SquareMatrix(&local_9b8,cVar6,m01,cVar5,cVar4);
  qclab::dense::SquareMatrix<std::complex<float>_>::operator=
            ((SquareMatrix<std::complex<float>_> *)&gtest_ar__12.message_,&local_9b8);
  qclab::dense::SquareMatrix<std::complex<float>_>::~SquareMatrix(&local_9b8);
  cVar5._M_value = 0x4c;
  cVar6._M_value = 1;
  cVar4._M_value = (_ComplexT)&gtest_ar__12.message_;
  pcVar3 = (char *)0x0;
  qclab::qgates::PauliX<std::complex<float>_>::apply
            ((PauliX<std::complex<float>_> *)&mat1.data_,Left,NoTrans,1,
             (SquareMatrix<std::complex<float>_> *)cVar4._M_value,0);
  std::complex<float>::complex(&local_9f0,3.0,0.0);
  std::complex<float>::complex(&local_9f8,2.0,0.0);
  std::complex<float>::complex(&local_a00,7.0,0.0);
  std::complex<float>::complex((complex<float> *)&gtest_ar__13.message_,5.0,0.0);
  qclab::dense::SquareMatrix<std::complex<float>_>::SquareMatrix
            ((SquareMatrix<std::complex<float>_> *)local_9e8,cVar5,m01_00,cVar6,cVar4);
  local_a19 = qclab::dense::SquareMatrix<std::complex<float>_>::operator==
                        ((SquareMatrix<std::complex<float>_> *)&gtest_ar__12.message_,
                         (SquareMatrix<std::complex<float>_> *)local_9e8);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_a18,&local_a19,(type *)0x0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_a18);
  if (!bVar2) {
    testing::Message::Message(&local_a28);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&mat2.data_,(internal *)local_a18,(AssertionResult *)"mat1 == check1",
               "false","true",pcVar3);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_a30,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/QGate1.cpp"
               ,0xbd,pcVar3);
    testing::internal::AssertHelper::operator=(&local_a30,&local_a28);
    testing::internal::AssertHelper::~AssertHelper(&local_a30);
    std::__cxx11::string::~string((string *)&mat2.data_);
    testing::Message::~Message(&local_a28);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_a18);
  qclab::dense::SquareMatrix<std::complex<float>_>::SquareMatrix
            ((SquareMatrix<std::complex<float>_> *)&gtest_ar__14.message_,
             (SquareMatrix<std::complex<float>_> *)local_28);
  pcVar3 = (char *)0x0;
  qclab::qgates::PauliX<std::complex<float>_>::apply
            ((PauliX<std::complex<float>_> *)&mat1.data_,Left,NoTrans,2,
             (SquareMatrix<std::complex<float>_> *)&gtest_ar__14.message_,0);
  qclab::qgates::PauliX<std::complex<float>_>::matrix((PauliX<std::complex<float>_> *)&local_a98);
  qclab::dense::kron<std::complex<float>>
            ((dense *)&local_a88,&local_a98,(SquareMatrix<std::complex<float>_> *)&I2.data_);
  local_a71 = qclab::dense::SquareMatrix<std::complex<float>_>::operator==
                        ((SquareMatrix<std::complex<float>_> *)&gtest_ar__14.message_,&local_a88);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_a70,&local_a71,(type *)0x0);
  qclab::dense::SquareMatrix<std::complex<float>_>::~SquareMatrix(&local_a88);
  qclab::dense::SquareMatrix<std::complex<float>_>::~SquareMatrix(&local_a98);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_a70);
  if (!bVar2) {
    testing::Message::Message(&local_aa0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__15.message_,(internal *)local_a70,
               (AssertionResult *)"mat2 == qclab::dense::kron( X.matrix() , I1 )","false","true",
               pcVar3);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_aa8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/QGate1.cpp"
               ,0xc2,pcVar3);
    testing::internal::AssertHelper::operator=(&local_aa8,&local_aa0);
    testing::internal::AssertHelper::~AssertHelper(&local_aa8);
    std::__cxx11::string::~string((string *)&gtest_ar__15.message_);
    testing::Message::~Message(&local_aa0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_a70);
  qclab::qgates::QGate1<std::complex<float>_>::setQubit
            ((QGate1<std::complex<float>_> *)&mat1.data_,1);
  qclab::dense::SquareMatrix<std::complex<float>_>::operator=
            ((SquareMatrix<std::complex<float>_> *)&gtest_ar__14.message_,
             (SquareMatrix<std::complex<float>_> *)local_28);
  pcVar3 = (char *)0x0;
  qclab::qgates::PauliX<std::complex<float>_>::apply
            ((PauliX<std::complex<float>_> *)&mat1.data_,Left,NoTrans,2,
             (SquareMatrix<std::complex<float>_> *)&gtest_ar__14.message_,0);
  qclab::qgates::PauliX<std::complex<float>_>::matrix((PauliX<std::complex<float>_> *)&local_b00);
  qclab::dense::kron<std::complex<float>>
            ((dense *)&local_af0,(SquareMatrix<std::complex<float>_> *)&I2.data_,&local_b00);
  local_ad9 = qclab::dense::SquareMatrix<std::complex<float>_>::operator==
                        ((SquareMatrix<std::complex<float>_> *)&gtest_ar__14.message_,&local_af0);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_ad8,&local_ad9,(type *)0x0);
  qclab::dense::SquareMatrix<std::complex<float>_>::~SquareMatrix(&local_af0);
  qclab::dense::SquareMatrix<std::complex<float>_>::~SquareMatrix(&local_b00);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_ad8);
  if (!bVar2) {
    testing::Message::Message(&local_b08);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&mat3.data_,(internal *)local_ad8,
               (AssertionResult *)"mat2 == qclab::dense::kron( I1 , X.matrix() )","false","true",
               pcVar3);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_b10,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/QGate1.cpp"
               ,199,pcVar3);
    testing::internal::AssertHelper::operator=(&local_b10,&local_b08);
    testing::internal::AssertHelper::~AssertHelper(&local_b10);
    std::__cxx11::string::~string((string *)&mat3.data_);
    testing::Message::~Message(&local_b08);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_ad8);
  qclab::dense::SquareMatrix<std::complex<float>_>::SquareMatrix
            ((SquareMatrix<std::complex<float>_> *)&gtest_ar__16.message_,
             (SquareMatrix<std::complex<float>_> *)
             &v1.super__Vector_base<std::complex<float>,_std::allocator<std::complex<float>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  pcVar3 = (char *)0x0;
  qclab::qgates::PauliX<std::complex<float>_>::apply
            ((PauliX<std::complex<float>_> *)&mat1.data_,Left,NoTrans,3,
             (SquareMatrix<std::complex<float>_> *)&gtest_ar__16.message_,0);
  qclab::qgates::PauliX<std::complex<float>_>::matrix((PauliX<std::complex<float>_> *)&local_b88);
  qclab::dense::kron<std::complex<float>>
            ((dense *)&local_b78,&local_b88,(SquareMatrix<std::complex<float>_> *)&I2.data_);
  qclab::dense::kron<std::complex<float>>
            ((dense *)&local_b68,(SquareMatrix<std::complex<float>_> *)&I2.data_,&local_b78);
  local_b51 = qclab::dense::SquareMatrix<std::complex<float>_>::operator==
                        ((SquareMatrix<std::complex<float>_> *)&gtest_ar__16.message_,&local_b68);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_b50,&local_b51,(type *)0x0);
  qclab::dense::SquareMatrix<std::complex<float>_>::~SquareMatrix(&local_b68);
  qclab::dense::SquareMatrix<std::complex<float>_>::~SquareMatrix(&local_b78);
  qclab::dense::SquareMatrix<std::complex<float>_>::~SquareMatrix(&local_b88);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_b50);
  if (!bVar2) {
    testing::Message::Message(&local_b90);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&X_2.super_QGate1<std::complex<float>_>.qubit_,(internal *)local_b50,
               (AssertionResult *)
               "mat3 == qclab::dense::kron( I1 , qclab::dense::kron( X.matrix() , I1 ) )","false",
               "true",pcVar3);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_b98,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/QGate1.cpp"
               ,0xcd,pcVar3);
    testing::internal::AssertHelper::operator=(&local_b98,&local_b90);
    testing::internal::AssertHelper::~AssertHelper(&local_b98);
    std::__cxx11::string::~string((string *)&X_2.super_QGate1<std::complex<float>_>.qubit_);
    testing::Message::~Message(&local_b90);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_b50);
  qclab::dense::SquareMatrix<std::complex<float>_>::~SquareMatrix
            ((SquareMatrix<std::complex<float>_> *)&gtest_ar__16.message_);
  qclab::dense::SquareMatrix<std::complex<float>_>::~SquareMatrix
            ((SquareMatrix<std::complex<float>_> *)&gtest_ar__14.message_);
  qclab::dense::SquareMatrix<std::complex<float>_>::~SquareMatrix
            ((SquareMatrix<std::complex<float>_> *)local_9e8);
  qclab::dense::SquareMatrix<std::complex<float>_>::~SquareMatrix
            ((SquareMatrix<std::complex<float>_> *)&gtest_ar__12.message_);
  qclab::qgates::PauliX<std::complex<float>_>::~PauliX((PauliX<std::complex<float>_> *)&mat1.data_);
  qclab::qgates::PauliX<std::complex<float>_>::PauliX
            ((PauliX<std::complex<float>_> *)&mat1_1.data_,0);
  qclab::dense::SquareMatrix<std::complex<float>_>::SquareMatrix
            ((SquareMatrix<std::complex<float>_> *)&gtest_ar__17.message_,
             (SquareMatrix<std::complex<float>_> *)&I2.data_);
  cVar5._M_value = 1;
  cVar4._M_value = (_ComplexT)&gtest_ar__17.message_;
  pcVar3 = (char *)0x0;
  qclab::qgates::PauliX<std::complex<float>_>::apply
            ((PauliX<std::complex<float>_> *)&mat1_1.data_,Right,NoTrans,1,
             (SquareMatrix<std::complex<float>_> *)cVar4._M_value,0);
  qclab::qgates::PauliX<std::complex<float>_>::matrix((PauliX<std::complex<float>_> *)&local_c00);
  local_be9[0] = qclab::dense::SquareMatrix<std::complex<float>_>::operator==
                           ((SquareMatrix<std::complex<float>_> *)&gtest_ar__17.message_,&local_c00)
  ;
  cVar6._M_value = (_ComplexT)local_be9;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)(local_be9 + 1),(bool *)cVar6._M_value,(type *)0x0);
  qclab::dense::SquareMatrix<std::complex<float>_>::~SquareMatrix(&local_c00);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)(local_be9 + 1));
  if (!bVar2) {
    testing::Message::Message(&local_c08);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_c30,(internal *)(local_be9 + 1),(AssertionResult *)"mat1 == X.matrix()",
               "false","true",pcVar3);
    cVar4._M_value = std::__cxx11::string::c_str();
    cVar5._M_value = 0xd7;
    testing::internal::AssertHelper::AssertHelper
              (&local_c10,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/QGate1.cpp"
               ,0xd7,(char *)cVar4._M_value);
    cVar6._M_value = (_ComplexT)&local_c08;
    testing::internal::AssertHelper::operator=(&local_c10,(Message *)cVar6._M_value);
    testing::internal::AssertHelper::~AssertHelper(&local_c10);
    std::__cxx11::string::~string((string *)&local_c30);
    testing::Message::~Message(&local_c08);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)(local_be9 + 1));
  std::complex<float>::complex(&local_c48,2.0,0.0);
  std::complex<float>::complex(&local_c50,3.0,0.0);
  std::complex<float>::complex(&local_c58,5.0,0.0);
  std::complex<float>::complex((complex<float> *)&check1_3.data_,7.0,0.0);
  qclab::dense::SquareMatrix<std::complex<float>_>::SquareMatrix
            (&local_c40,cVar6,m01_01,cVar5,cVar4);
  qclab::dense::SquareMatrix<std::complex<float>_>::operator=
            ((SquareMatrix<std::complex<float>_> *)&gtest_ar__17.message_,&local_c40);
  qclab::dense::SquareMatrix<std::complex<float>_>::~SquareMatrix(&local_c40);
  cVar5._M_value = 0x52;
  cVar6._M_value = 1;
  cVar4._M_value = (_ComplexT)&gtest_ar__17.message_;
  pcVar3 = (char *)0x0;
  qclab::qgates::PauliX<std::complex<float>_>::apply
            ((PauliX<std::complex<float>_> *)&mat1_1.data_,Right,NoTrans,1,
             (SquareMatrix<std::complex<float>_> *)cVar4._M_value,0);
  std::complex<float>::complex(&local_c78,5.0,0.0);
  std::complex<float>::complex(&local_c80,7.0,0.0);
  std::complex<float>::complex(&local_c88,2.0,0.0);
  std::complex<float>::complex((complex<float> *)&gtest_ar__18.message_,3.0,0.0);
  qclab::dense::SquareMatrix<std::complex<float>_>::SquareMatrix
            ((SquareMatrix<std::complex<float>_> *)local_c70,cVar5,m01_02,cVar6,cVar4);
  local_ca1 = qclab::dense::SquareMatrix<std::complex<float>_>::operator==
                        ((SquareMatrix<std::complex<float>_> *)&gtest_ar__17.message_,
                         (SquareMatrix<std::complex<float>_> *)local_c70);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_ca0,&local_ca1,(type *)0x0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_ca0);
  if (!bVar2) {
    testing::Message::Message(&local_cb0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&mat2_1.data_,(internal *)local_ca0,(AssertionResult *)"mat1 == check1",
               "false","true",pcVar3);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_cb8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/QGate1.cpp"
               ,0xdd,pcVar3);
    testing::internal::AssertHelper::operator=(&local_cb8,&local_cb0);
    testing::internal::AssertHelper::~AssertHelper(&local_cb8);
    std::__cxx11::string::~string((string *)&mat2_1.data_);
    testing::Message::~Message(&local_cb0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_ca0);
  qclab::dense::SquareMatrix<std::complex<float>_>::SquareMatrix
            ((SquareMatrix<std::complex<float>_> *)&gtest_ar__19.message_,
             (SquareMatrix<std::complex<float>_> *)local_28);
  pcVar3 = (char *)0x0;
  qclab::qgates::PauliX<std::complex<float>_>::apply
            ((PauliX<std::complex<float>_> *)&mat1_1.data_,Right,NoTrans,2,
             (SquareMatrix<std::complex<float>_> *)&gtest_ar__19.message_,0);
  qclab::qgates::PauliX<std::complex<float>_>::matrix((PauliX<std::complex<float>_> *)&local_d20);
  qclab::dense::kron<std::complex<float>>
            ((dense *)&local_d10,&local_d20,(SquareMatrix<std::complex<float>_> *)&I2.data_);
  local_cf9 = qclab::dense::SquareMatrix<std::complex<float>_>::operator==
                        ((SquareMatrix<std::complex<float>_> *)&gtest_ar__19.message_,&local_d10);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_cf8,&local_cf9,(type *)0x0);
  qclab::dense::SquareMatrix<std::complex<float>_>::~SquareMatrix(&local_d10);
  qclab::dense::SquareMatrix<std::complex<float>_>::~SquareMatrix(&local_d20);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_cf8);
  if (!bVar2) {
    testing::Message::Message(&local_d28);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__20.message_,(internal *)local_cf8,
               (AssertionResult *)"mat2 == qclab::dense::kron( X.matrix() , I1 )","false","true",
               pcVar3);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_d30,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/QGate1.cpp"
               ,0xe2,pcVar3);
    testing::internal::AssertHelper::operator=(&local_d30,&local_d28);
    testing::internal::AssertHelper::~AssertHelper(&local_d30);
    std::__cxx11::string::~string((string *)&gtest_ar__20.message_);
    testing::Message::~Message(&local_d28);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_cf8);
  qclab::qgates::QGate1<std::complex<float>_>::setQubit
            ((QGate1<std::complex<float>_> *)&mat1_1.data_,1);
  qclab::dense::SquareMatrix<std::complex<float>_>::operator=
            ((SquareMatrix<std::complex<float>_> *)&gtest_ar__19.message_,
             (SquareMatrix<std::complex<float>_> *)local_28);
  pcVar3 = (char *)0x0;
  qclab::qgates::PauliX<std::complex<float>_>::apply
            ((PauliX<std::complex<float>_> *)&mat1_1.data_,Right,NoTrans,2,
             (SquareMatrix<std::complex<float>_> *)&gtest_ar__19.message_,0);
  qclab::qgates::PauliX<std::complex<float>_>::matrix((PauliX<std::complex<float>_> *)&local_d88);
  qclab::dense::kron<std::complex<float>>
            ((dense *)&local_d78,(SquareMatrix<std::complex<float>_> *)&I2.data_,&local_d88);
  local_d61 = qclab::dense::SquareMatrix<std::complex<float>_>::operator==
                        ((SquareMatrix<std::complex<float>_> *)&gtest_ar__19.message_,&local_d78);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_d60,&local_d61,(type *)0x0);
  qclab::dense::SquareMatrix<std::complex<float>_>::~SquareMatrix(&local_d78);
  qclab::dense::SquareMatrix<std::complex<float>_>::~SquareMatrix(&local_d88);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_d60);
  if (!bVar2) {
    testing::Message::Message(&local_d90);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&mat3_1.data_,(internal *)local_d60,
               (AssertionResult *)"mat2 == qclab::dense::kron( I1 , X.matrix() )","false","true",
               pcVar3);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_d98,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/QGate1.cpp"
               ,0xe7,pcVar3);
    testing::internal::AssertHelper::operator=(&local_d98,&local_d90);
    testing::internal::AssertHelper::~AssertHelper(&local_d98);
    std::__cxx11::string::~string((string *)&mat3_1.data_);
    testing::Message::~Message(&local_d90);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_d60);
  qclab::dense::SquareMatrix<std::complex<float>_>::SquareMatrix
            ((SquareMatrix<std::complex<float>_> *)&gtest_ar__21.message_,
             (SquareMatrix<std::complex<float>_> *)
             &v1.super__Vector_base<std::complex<float>,_std::allocator<std::complex<float>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  pcVar3 = (char *)0x0;
  qclab::qgates::PauliX<std::complex<float>_>::apply
            ((PauliX<std::complex<float>_> *)&mat1_1.data_,Right,NoTrans,3,
             (SquareMatrix<std::complex<float>_> *)&gtest_ar__21.message_,0);
  qclab::qgates::PauliX<std::complex<float>_>::matrix((PauliX<std::complex<float>_> *)&local_e10);
  qclab::dense::kron<std::complex<float>>
            ((dense *)&local_e00,&local_e10,(SquareMatrix<std::complex<float>_> *)&I2.data_);
  qclab::dense::kron<std::complex<float>>
            ((dense *)&local_df0,(SquareMatrix<std::complex<float>_> *)&I2.data_,&local_e00);
  local_dd9 = qclab::dense::SquareMatrix<std::complex<float>_>::operator==
                        ((SquareMatrix<std::complex<float>_> *)&gtest_ar__21.message_,&local_df0);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_dd8,&local_dd9,(type *)0x0);
  qclab::dense::SquareMatrix<std::complex<float>_>::~SquareMatrix(&local_df0);
  qclab::dense::SquareMatrix<std::complex<float>_>::~SquareMatrix(&local_e00);
  qclab::dense::SquareMatrix<std::complex<float>_>::~SquareMatrix(&local_e10);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_dd8);
  if (!bVar2) {
    testing::Message::Message(&local_e18);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&Y_1.super_QRotationGate1<std::complex<float>_>.rotation_,
               (internal *)local_dd8,
               (AssertionResult *)
               "mat3 == qclab::dense::kron( I1 , qclab::dense::kron( X.matrix() , I1 ) )","false",
               "true",pcVar3);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_e20,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/QGate1.cpp"
               ,0xed,pcVar3);
    testing::internal::AssertHelper::operator=(&local_e20,&local_e18);
    testing::internal::AssertHelper::~AssertHelper(&local_e20);
    std::__cxx11::string::~string
              ((string *)&Y_1.super_QRotationGate1<std::complex<float>_>.rotation_);
    testing::Message::~Message(&local_e18);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_dd8);
  qclab::dense::SquareMatrix<std::complex<float>_>::~SquareMatrix
            ((SquareMatrix<std::complex<float>_> *)&gtest_ar__21.message_);
  qclab::dense::SquareMatrix<std::complex<float>_>::~SquareMatrix
            ((SquareMatrix<std::complex<float>_> *)&gtest_ar__19.message_);
  qclab::dense::SquareMatrix<std::complex<float>_>::~SquareMatrix
            ((SquareMatrix<std::complex<float>_> *)local_c70);
  qclab::dense::SquareMatrix<std::complex<float>_>::~SquareMatrix
            ((SquareMatrix<std::complex<float>_> *)&gtest_ar__17.message_);
  qclab::qgates::PauliX<std::complex<float>_>::~PauliX
            ((PauliX<std::complex<float>_> *)&mat1_1.data_);
  qclab::qgates::RotationY<std::complex<float>_>::RotationY
            ((RotationY<std::complex<float>_> *)&Ytrans.data_,0,0.0,1.0,false);
  qclab::qgates::RotationY<std::complex<float>_>::matrix
            ((RotationY<std::complex<float>_> *)&mat1_2.data_);
  qclab::dense::trans<qclab::dense::SquareMatrix<std::complex<float>>>
            ((dense *)local_e68,(SquareMatrix<std::complex<float>_> *)&mat1_2.data_);
  qclab::dense::SquareMatrix<std::complex<float>_>::~SquareMatrix
            ((SquareMatrix<std::complex<float>_> *)&mat1_2.data_);
  qclab::dense::SquareMatrix<std::complex<float>_>::SquareMatrix
            ((SquareMatrix<std::complex<float>_> *)&gtest_ar__22.message_,
             (SquareMatrix<std::complex<float>_> *)&I2.data_);
  cVar5._M_value = 1;
  cVar4._M_value = (_ComplexT)&gtest_ar__22.message_;
  pcVar3 = (char *)0x0;
  qclab::qgates::RotationY<std::complex<float>_>::apply
            ((RotationY<std::complex<float>_> *)&Ytrans.data_,Left,Trans,1,
             (SquareMatrix<std::complex<float>_> *)cVar4._M_value,0);
  local_e99[0] = qclab::dense::SquareMatrix<std::complex<float>_>::operator==
                           ((SquareMatrix<std::complex<float>_> *)&gtest_ar__22.message_,
                            (SquareMatrix<std::complex<float>_> *)local_e68);
  cVar6._M_value = (_ComplexT)local_e99;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)(local_e99 + 1),(bool *)cVar6._M_value,(type *)0x0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)(local_e99 + 1));
  if (!bVar2) {
    testing::Message::Message(&local_ea8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_ed0,(internal *)(local_e99 + 1),(AssertionResult *)"mat1 == Ytrans","false",
               "true",pcVar3);
    cVar4._M_value = std::__cxx11::string::c_str();
    cVar5._M_value = 0xf8;
    testing::internal::AssertHelper::AssertHelper
              (&local_eb0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/QGate1.cpp"
               ,0xf8,(char *)cVar4._M_value);
    cVar6._M_value = (_ComplexT)&local_ea8;
    testing::internal::AssertHelper::operator=(&local_eb0,(Message *)cVar6._M_value);
    testing::internal::AssertHelper::~AssertHelper(&local_eb0);
    std::__cxx11::string::~string((string *)&local_ed0);
    testing::Message::~Message(&local_ea8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)(local_e99 + 1));
  std::complex<float>::complex(&local_ee8,2.0,0.0);
  std::complex<float>::complex(&local_ef0,3.0,0.0);
  std::complex<float>::complex(&local_ef8,5.0,0.0);
  std::complex<float>::complex((complex<float> *)&check1_4.data_,7.0,0.0);
  qclab::dense::SquareMatrix<std::complex<float>_>::SquareMatrix
            (&local_ee0,cVar6,m01_03,cVar5,cVar4);
  qclab::dense::SquareMatrix<std::complex<float>_>::operator=
            ((SquareMatrix<std::complex<float>_> *)&gtest_ar__22.message_,&local_ee0);
  qclab::dense::SquareMatrix<std::complex<float>_>::~SquareMatrix(&local_ee0);
  cVar5._M_value = 0x4c;
  cVar6._M_value = 1;
  cVar4._M_value = (_ComplexT)&gtest_ar__22.message_;
  pcVar3 = (char *)0x0;
  qclab::qgates::RotationY<std::complex<float>_>::apply
            ((RotationY<std::complex<float>_> *)&Ytrans.data_,Left,Trans,1,
             (SquareMatrix<std::complex<float>_> *)cVar4._M_value,0);
  std::complex<float>::complex(&local_f18,-3.0,0.0);
  std::complex<float>::complex(&local_f20,2.0,0.0);
  std::complex<float>::complex(&local_f28,-7.0,0.0);
  std::complex<float>::complex((complex<float> *)&gtest_ar__23.message_,5.0,0.0);
  qclab::dense::SquareMatrix<std::complex<float>_>::SquareMatrix
            ((SquareMatrix<std::complex<float>_> *)local_f10,cVar5,m01_04,cVar6,cVar4);
  local_f41 = qclab::dense::SquareMatrix<std::complex<float>_>::operator==
                        ((SquareMatrix<std::complex<float>_> *)&gtest_ar__22.message_,
                         (SquareMatrix<std::complex<float>_> *)local_f10);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_f40,&local_f41,(type *)0x0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_f40);
  if (!bVar2) {
    testing::Message::Message(&local_f50);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&mat2_2.data_,(internal *)local_f40,(AssertionResult *)"mat1 == check1",
               "false","true",pcVar3);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_f58,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/QGate1.cpp"
               ,0xfe,pcVar3);
    testing::internal::AssertHelper::operator=(&local_f58,&local_f50);
    testing::internal::AssertHelper::~AssertHelper(&local_f58);
    std::__cxx11::string::~string((string *)&mat2_2.data_);
    testing::Message::~Message(&local_f50);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_f40);
  qclab::dense::SquareMatrix<std::complex<float>_>::SquareMatrix
            ((SquareMatrix<std::complex<float>_> *)&gtest_ar__24.message_,
             (SquareMatrix<std::complex<float>_> *)local_28);
  pcVar3 = (char *)0x0;
  qclab::qgates::RotationY<std::complex<float>_>::apply
            ((RotationY<std::complex<float>_> *)&Ytrans.data_,Left,Trans,2,
             (SquareMatrix<std::complex<float>_> *)&gtest_ar__24.message_,0);
  qclab::dense::kron<std::complex<float>>
            ((dense *)&local_fb0,(SquareMatrix<std::complex<float>_> *)local_e68,
             (SquareMatrix<std::complex<float>_> *)&I2.data_);
  local_f99 = qclab::dense::SquareMatrix<std::complex<float>_>::operator==
                        ((SquareMatrix<std::complex<float>_> *)&gtest_ar__24.message_,&local_fb0);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_f98,&local_f99,(type *)0x0);
  qclab::dense::SquareMatrix<std::complex<float>_>::~SquareMatrix(&local_fb0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_f98);
  if (!bVar2) {
    testing::Message::Message(&local_fb8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__25.message_,(internal *)local_f98,
               (AssertionResult *)"mat2 == qclab::dense::kron( Ytrans , I1 )","false","true",pcVar3)
    ;
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_fc0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/QGate1.cpp"
               ,0x103,pcVar3);
    testing::internal::AssertHelper::operator=(&local_fc0,&local_fb8);
    testing::internal::AssertHelper::~AssertHelper(&local_fc0);
    std::__cxx11::string::~string((string *)&gtest_ar__25.message_);
    testing::Message::~Message(&local_fb8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_f98);
  qclab::qgates::QGate1<std::complex<float>_>::setQubit
            ((QGate1<std::complex<float>_> *)&Ytrans.data_,1);
  qclab::dense::SquareMatrix<std::complex<float>_>::operator=
            ((SquareMatrix<std::complex<float>_> *)&gtest_ar__24.message_,
             (SquareMatrix<std::complex<float>_> *)local_28);
  pcVar3 = (char *)0x0;
  qclab::qgates::RotationY<std::complex<float>_>::apply
            ((RotationY<std::complex<float>_> *)&Ytrans.data_,Left,Trans,2,
             (SquareMatrix<std::complex<float>_> *)&gtest_ar__24.message_,0);
  qclab::dense::kron<std::complex<float>>
            ((dense *)&local_1008,(SquareMatrix<std::complex<float>_> *)&I2.data_,
             (SquareMatrix<std::complex<float>_> *)local_e68);
  local_ff1 = qclab::dense::SquareMatrix<std::complex<float>_>::operator==
                        ((SquareMatrix<std::complex<float>_> *)&gtest_ar__24.message_,&local_1008);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_ff0,&local_ff1,(type *)0x0);
  qclab::dense::SquareMatrix<std::complex<float>_>::~SquareMatrix(&local_1008);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_ff0);
  if (!bVar2) {
    testing::Message::Message(&local_1010);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&mat3_2.data_,(internal *)local_ff0,
               (AssertionResult *)"mat2 == qclab::dense::kron( I1 , Ytrans )","false","true",pcVar3)
    ;
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_1018,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/QGate1.cpp"
               ,0x108,pcVar3);
    testing::internal::AssertHelper::operator=(&local_1018,&local_1010);
    testing::internal::AssertHelper::~AssertHelper(&local_1018);
    std::__cxx11::string::~string((string *)&mat3_2.data_);
    testing::Message::~Message(&local_1010);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_ff0);
  qclab::dense::SquareMatrix<std::complex<float>_>::SquareMatrix
            ((SquareMatrix<std::complex<float>_> *)&gtest_ar__26.message_,
             (SquareMatrix<std::complex<float>_> *)
             &v1.super__Vector_base<std::complex<float>,_std::allocator<std::complex<float>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  pcVar3 = (char *)0x0;
  qclab::qgates::RotationY<std::complex<float>_>::apply
            ((RotationY<std::complex<float>_> *)&Ytrans.data_,Left,Trans,3,
             (SquareMatrix<std::complex<float>_> *)&gtest_ar__26.message_,0);
  qclab::dense::kron<std::complex<float>>
            ((dense *)&local_1080,(SquareMatrix<std::complex<float>_> *)local_e68,
             (SquareMatrix<std::complex<float>_> *)&I2.data_);
  qclab::dense::kron<std::complex<float>>
            ((dense *)&local_1070,(SquareMatrix<std::complex<float>_> *)&I2.data_,&local_1080);
  local_1059 = qclab::dense::SquareMatrix<std::complex<float>_>::operator==
                         ((SquareMatrix<std::complex<float>_> *)&gtest_ar__26.message_,&local_1070);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_1058,&local_1059,(type *)0x0);
  qclab::dense::SquareMatrix<std::complex<float>_>::~SquareMatrix(&local_1070);
  qclab::dense::SquareMatrix<std::complex<float>_>::~SquareMatrix(&local_1080);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1058);
  if (!bVar2) {
    testing::Message::Message(&local_1088);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&Y_2.super_QRotationGate1<std::complex<float>_>.rotation_,
               (internal *)local_1058,
               (AssertionResult *)
               "mat3 == qclab::dense::kron( I1 , qclab::dense::kron( Ytrans , I1 ) )","false","true"
               ,pcVar3);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_1090,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/QGate1.cpp"
               ,0x10e,pcVar3);
    testing::internal::AssertHelper::operator=(&local_1090,&local_1088);
    testing::internal::AssertHelper::~AssertHelper(&local_1090);
    std::__cxx11::string::~string
              ((string *)&Y_2.super_QRotationGate1<std::complex<float>_>.rotation_);
    testing::Message::~Message(&local_1088);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1058);
  qclab::dense::SquareMatrix<std::complex<float>_>::~SquareMatrix
            ((SquareMatrix<std::complex<float>_> *)&gtest_ar__26.message_);
  qclab::dense::SquareMatrix<std::complex<float>_>::~SquareMatrix
            ((SquareMatrix<std::complex<float>_> *)&gtest_ar__24.message_);
  qclab::dense::SquareMatrix<std::complex<float>_>::~SquareMatrix
            ((SquareMatrix<std::complex<float>_> *)local_f10);
  qclab::dense::SquareMatrix<std::complex<float>_>::~SquareMatrix
            ((SquareMatrix<std::complex<float>_> *)&gtest_ar__22.message_);
  qclab::dense::SquareMatrix<std::complex<float>_>::~SquareMatrix
            ((SquareMatrix<std::complex<float>_> *)local_e68);
  qclab::qgates::RotationY<std::complex<float>_>::~RotationY
            ((RotationY<std::complex<float>_> *)&Ytrans.data_);
  qclab::qgates::RotationY<std::complex<float>_>::RotationY
            ((RotationY<std::complex<float>_> *)&Ytrans_1.data_,0,0.0,1.0,false);
  qclab::qgates::RotationY<std::complex<float>_>::matrix
            ((RotationY<std::complex<float>_> *)&mat1_3.data_);
  qclab::dense::trans<qclab::dense::SquareMatrix<std::complex<float>>>
            ((dense *)local_10d8,(SquareMatrix<std::complex<float>_> *)&mat1_3.data_);
  qclab::dense::SquareMatrix<std::complex<float>_>::~SquareMatrix
            ((SquareMatrix<std::complex<float>_> *)&mat1_3.data_);
  qclab::dense::SquareMatrix<std::complex<float>_>::SquareMatrix
            ((SquareMatrix<std::complex<float>_> *)&gtest_ar__27.message_,
             (SquareMatrix<std::complex<float>_> *)&I2.data_);
  cVar5._M_value = 1;
  cVar4._M_value = (_ComplexT)&gtest_ar__27.message_;
  pcVar3 = (char *)0x0;
  qclab::qgates::RotationY<std::complex<float>_>::apply
            ((RotationY<std::complex<float>_> *)&Ytrans_1.data_,Right,Trans,1,
             (SquareMatrix<std::complex<float>_> *)cVar4._M_value,0);
  local_1109[0] =
       qclab::dense::SquareMatrix<std::complex<float>_>::operator==
                 ((SquareMatrix<std::complex<float>_> *)&gtest_ar__27.message_,
                  (SquareMatrix<std::complex<float>_> *)local_10d8);
  cVar6._M_value = (_ComplexT)local_1109;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)(local_1109 + 1),(bool *)cVar6._M_value,(type *)0x0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)(local_1109 + 1));
  if (!bVar2) {
    testing::Message::Message(&local_1118);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_1140,(internal *)(local_1109 + 1),(AssertionResult *)"mat1 == Ytrans","false",
               "true",pcVar3);
    cVar4._M_value = std::__cxx11::string::c_str();
    cVar5._M_value = 0x119;
    testing::internal::AssertHelper::AssertHelper
              (&local_1120,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/QGate1.cpp"
               ,0x119,(char *)cVar4._M_value);
    cVar6._M_value = (_ComplexT)&local_1118;
    testing::internal::AssertHelper::operator=(&local_1120,(Message *)cVar6._M_value);
    testing::internal::AssertHelper::~AssertHelper(&local_1120);
    std::__cxx11::string::~string((string *)&local_1140);
    testing::Message::~Message(&local_1118);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)(local_1109 + 1));
  std::complex<float>::complex(&local_1158,2.0,0.0);
  std::complex<float>::complex(&local_1160,3.0,0.0);
  std::complex<float>::complex(&local_1168,5.0,0.0);
  std::complex<float>::complex((complex<float> *)&check1_5.data_,7.0,0.0);
  qclab::dense::SquareMatrix<std::complex<float>_>::SquareMatrix
            (&local_1150,cVar6,m01_05,cVar5,cVar4);
  qclab::dense::SquareMatrix<std::complex<float>_>::operator=
            ((SquareMatrix<std::complex<float>_> *)&gtest_ar__27.message_,&local_1150);
  qclab::dense::SquareMatrix<std::complex<float>_>::~SquareMatrix(&local_1150);
  cVar5._M_value = 0x52;
  cVar6._M_value = 1;
  cVar4._M_value = (_ComplexT)&gtest_ar__27.message_;
  pcVar3 = (char *)0x0;
  qclab::qgates::RotationY<std::complex<float>_>::apply
            ((RotationY<std::complex<float>_> *)&Ytrans_1.data_,Right,Trans,1,
             (SquareMatrix<std::complex<float>_> *)cVar4._M_value,0);
  std::complex<float>::complex(&local_1188,5.0,0.0);
  std::complex<float>::complex(&local_1190,7.0,0.0);
  std::complex<float>::complex(&local_1198,-2.0,0.0);
  std::complex<float>::complex((complex<float> *)&gtest_ar__28.message_,-3.0,0.0);
  qclab::dense::SquareMatrix<std::complex<float>_>::SquareMatrix
            ((SquareMatrix<std::complex<float>_> *)local_1180,cVar5,m01_06,cVar6,cVar4);
  local_11b1 = qclab::dense::SquareMatrix<std::complex<float>_>::operator==
                         ((SquareMatrix<std::complex<float>_> *)&gtest_ar__27.message_,
                          (SquareMatrix<std::complex<float>_> *)local_1180);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_11b0,&local_11b1,(type *)0x0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_11b0);
  if (!bVar2) {
    testing::Message::Message(&local_11c0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&mat2_3.data_,(internal *)local_11b0,(AssertionResult *)"mat1 == check1",
               "false","true",pcVar3);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_11c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/QGate1.cpp"
               ,0x11f,pcVar3);
    testing::internal::AssertHelper::operator=(&local_11c8,&local_11c0);
    testing::internal::AssertHelper::~AssertHelper(&local_11c8);
    std::__cxx11::string::~string((string *)&mat2_3.data_);
    testing::Message::~Message(&local_11c0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_11b0);
  qclab::dense::SquareMatrix<std::complex<float>_>::SquareMatrix
            ((SquareMatrix<std::complex<float>_> *)&gtest_ar__29.message_,
             (SquareMatrix<std::complex<float>_> *)local_28);
  pcVar3 = (char *)0x0;
  qclab::qgates::RotationY<std::complex<float>_>::apply
            ((RotationY<std::complex<float>_> *)&Ytrans_1.data_,Right,Trans,2,
             (SquareMatrix<std::complex<float>_> *)&gtest_ar__29.message_,0);
  qclab::dense::kron<std::complex<float>>
            ((dense *)&local_1220,(SquareMatrix<std::complex<float>_> *)local_10d8,
             (SquareMatrix<std::complex<float>_> *)&I2.data_);
  local_1209 = qclab::dense::SquareMatrix<std::complex<float>_>::operator==
                         ((SquareMatrix<std::complex<float>_> *)&gtest_ar__29.message_,&local_1220);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_1208,&local_1209,(type *)0x0);
  qclab::dense::SquareMatrix<std::complex<float>_>::~SquareMatrix(&local_1220);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1208);
  if (!bVar2) {
    testing::Message::Message(&local_1228);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__30.message_,(internal *)local_1208,
               (AssertionResult *)"mat2 == qclab::dense::kron( Ytrans , I1 )","false","true",pcVar3)
    ;
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_1230,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/QGate1.cpp"
               ,0x124,pcVar3);
    testing::internal::AssertHelper::operator=(&local_1230,&local_1228);
    testing::internal::AssertHelper::~AssertHelper(&local_1230);
    std::__cxx11::string::~string((string *)&gtest_ar__30.message_);
    testing::Message::~Message(&local_1228);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1208);
  qclab::qgates::QGate1<std::complex<float>_>::setQubit
            ((QGate1<std::complex<float>_> *)&Ytrans_1.data_,1);
  qclab::dense::SquareMatrix<std::complex<float>_>::operator=
            ((SquareMatrix<std::complex<float>_> *)&gtest_ar__29.message_,
             (SquareMatrix<std::complex<float>_> *)local_28);
  pcVar3 = (char *)0x0;
  qclab::qgates::RotationY<std::complex<float>_>::apply
            ((RotationY<std::complex<float>_> *)&Ytrans_1.data_,Right,Trans,2,
             (SquareMatrix<std::complex<float>_> *)&gtest_ar__29.message_,0);
  qclab::dense::kron<std::complex<float>>
            ((dense *)&local_1278,(SquareMatrix<std::complex<float>_> *)&I2.data_,
             (SquareMatrix<std::complex<float>_> *)local_10d8);
  local_1261 = qclab::dense::SquareMatrix<std::complex<float>_>::operator==
                         ((SquareMatrix<std::complex<float>_> *)&gtest_ar__29.message_,&local_1278);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_1260,&local_1261,(type *)0x0);
  qclab::dense::SquareMatrix<std::complex<float>_>::~SquareMatrix(&local_1278);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1260);
  if (!bVar2) {
    testing::Message::Message(&local_1280);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&mat3_3.data_,(internal *)local_1260,
               (AssertionResult *)"mat2 == qclab::dense::kron( I1 , Ytrans )","false","true",pcVar3)
    ;
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_1288,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/QGate1.cpp"
               ,0x129,pcVar3);
    testing::internal::AssertHelper::operator=(&local_1288,&local_1280);
    testing::internal::AssertHelper::~AssertHelper(&local_1288);
    std::__cxx11::string::~string((string *)&mat3_3.data_);
    testing::Message::~Message(&local_1280);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1260);
  qclab::dense::SquareMatrix<std::complex<float>_>::SquareMatrix
            ((SquareMatrix<std::complex<float>_> *)&gtest_ar__31.message_,
             (SquareMatrix<std::complex<float>_> *)
             &v1.super__Vector_base<std::complex<float>,_std::allocator<std::complex<float>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  pcVar3 = (char *)0x0;
  qclab::qgates::RotationY<std::complex<float>_>::apply
            ((RotationY<std::complex<float>_> *)&Ytrans_1.data_,Right,Trans,3,
             (SquareMatrix<std::complex<float>_> *)&gtest_ar__31.message_,0);
  qclab::dense::kron<std::complex<float>>
            ((dense *)&local_12f0,(SquareMatrix<std::complex<float>_> *)local_10d8,
             (SquareMatrix<std::complex<float>_> *)&I2.data_);
  qclab::dense::kron<std::complex<float>>
            ((dense *)&local_12e0,(SquareMatrix<std::complex<float>_> *)&I2.data_,&local_12f0);
  local_12c9 = qclab::dense::SquareMatrix<std::complex<float>_>::operator==
                         ((SquareMatrix<std::complex<float>_> *)&gtest_ar__31.message_,&local_12e0);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_12c8,&local_12c9,(type *)0x0);
  qclab::dense::SquareMatrix<std::complex<float>_>::~SquareMatrix(&local_12e0);
  qclab::dense::SquareMatrix<std::complex<float>_>::~SquareMatrix(&local_12f0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_12c8);
  if (!bVar2) {
    testing::Message::Message(&local_12f8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_1320,(internal *)local_12c8,
               (AssertionResult *)
               "mat3 == qclab::dense::kron( I1 , qclab::dense::kron( Ytrans , I1 ) )","false","true"
               ,pcVar3);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_1300,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/QGate1.cpp"
               ,0x12f,pcVar3);
    testing::internal::AssertHelper::operator=(&local_1300,&local_12f8);
    testing::internal::AssertHelper::~AssertHelper(&local_1300);
    std::__cxx11::string::~string((string *)&local_1320);
    testing::Message::~Message(&local_12f8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_12c8);
  qclab::dense::SquareMatrix<std::complex<float>_>::~SquareMatrix
            ((SquareMatrix<std::complex<float>_> *)&gtest_ar__31.message_);
  qclab::dense::SquareMatrix<std::complex<float>_>::~SquareMatrix
            ((SquareMatrix<std::complex<float>_> *)&gtest_ar__29.message_);
  qclab::dense::SquareMatrix<std::complex<float>_>::~SquareMatrix
            ((SquareMatrix<std::complex<float>_> *)local_1180);
  qclab::dense::SquareMatrix<std::complex<float>_>::~SquareMatrix
            ((SquareMatrix<std::complex<float>_> *)&gtest_ar__27.message_);
  qclab::dense::SquareMatrix<std::complex<float>_>::~SquareMatrix
            ((SquareMatrix<std::complex<float>_> *)local_10d8);
  qclab::qgates::RotationY<std::complex<float>_>::~RotationY
            ((RotationY<std::complex<float>_> *)&Ytrans_1.data_);
  std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>::~vector
            ((vector<std::complex<float>,_std::allocator<std::complex<float>_>_> *)local_f8);
  std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>::~vector
            ((vector<std::complex<float>,_std::allocator<std::complex<float>_>_> *)local_a0);
  std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>::~vector
            ((vector<std::complex<float>,_std::allocator<std::complex<float>_>_> *)local_60);
  qclab::dense::SquareMatrix<std::complex<float>_>::~SquareMatrix
            ((SquareMatrix<std::complex<float>_> *)
             &v1.super__Vector_base<std::complex<float>,_std::allocator<std::complex<float>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  qclab::dense::SquareMatrix<std::complex<float>_>::~SquareMatrix
            ((SquareMatrix<std::complex<float>_> *)local_28);
  qclab::dense::SquareMatrix<std::complex<float>_>::~SquareMatrix
            ((SquareMatrix<std::complex<float>_> *)&I2.data_);
  return;
}

Assistant:

void test_qclab_qgates_QGate1() {

  using R = qclab::real_t< T > ;
  using V = std::vector< T > ;
  using M = qclab::dense::SquareMatrix< T > ;

  const auto I1 = qclab::dense::eye< T >( 2 ) ;
  const auto I2 = qclab::dense::eye< T >( 4 ) ;
  const auto I3 = qclab::dense::eye< T >( 8 ) ;

  const V v1 = { 3 , 5 } ;
  const V v2 = { 3 , 5 , 2 , 7 } ;
  const V v3 = { 3 , 5 , 2 , 7 , 4 , 1 , 8 , 3 } ;

  // apply (NoTrans)
  {
    qclab::qgates::PauliX< T >  X( 0 ) ;

    // nbQubits = 1
    auto vec1 = v1 ;
    X.apply( qclab::Op::NoTrans , 1 , vec1 ) ;
    V check1 = { 5 , 3 } ;
    EXPECT_TRUE( vec1 == check1 ) ;
  #ifdef QCLAB_OMP_OFFLOADING
    vec1 = v1 ; T* vec1_ = vec1.data() ;
    #pragma omp target data map(tofrom:vec1_[0:2])
    { X.apply_device( qclab::Op::NoTrans , 1 , vec1_ ) ; }
    EXPECT_TRUE( vec1 == check1 ) ;
  #endif

    // nbQubits = 2
    auto vec2 = v2 ;
    X.apply( qclab::Op::NoTrans , 2 , vec2 ) ;
    V check2 = { 2 , 7 , 3 , 5 } ;
    EXPECT_TRUE( vec2 == check2 ) ;
  #ifdef QCLAB_OMP_OFFLOADING
    vec2 = v2 ; T* vec2_ = vec2.data() ;
    #pragma omp target data map(tofrom:vec2_[0:4])
    { X.apply_device( qclab::Op::NoTrans , 2 , vec2_ ) ; }
    EXPECT_TRUE( vec2 == check2 ) ;
  #endif

    X.setQubit( 1 ) ;
    vec2 = v2 ;
    X.apply( qclab::Op::NoTrans , 2 , vec2 ) ;
    check2 = { 5 , 3 , 7 , 2 } ;
    EXPECT_TRUE( vec2 == check2 ) ;
  #ifdef QCLAB_OMP_OFFLOADING
    vec2 = v2 ;
    #pragma omp target data map(tofrom:vec2_[0:4])
    { X.apply_device( qclab::Op::NoTrans , 2 , vec2_ ) ; }
    EXPECT_TRUE( vec2 == check2 ) ;
  #endif

    // nbQubits = 3
    auto vec3 = v3 ;
    X.apply( qclab::Op::NoTrans , 3 , vec3 ) ;
    V check3 = { 2 , 7 , 3 , 5 , 8 , 3 , 4 , 1 } ;
    EXPECT_TRUE( vec3 == check3 ) ;
  #ifdef QCLAB_OMP_OFFLOADING
    vec3 = v3 ; T* vec3_ = vec3.data() ;
    #pragma omp target data map(tofrom:vec3_[0:8])
    { X.apply_device( qclab::Op::NoTrans , 3 , vec3_ ) ; }
    EXPECT_TRUE( vec3 == check3 ) ;
  #endif

    X.setQubit( 0 ) ;
    vec3 = v3 ;
    X.apply( qclab::Op::NoTrans , 3 , vec3 ) ;
    check3 = { 4 , 1 , 8 , 3 , 3 , 5 , 2 , 7 } ;
    EXPECT_TRUE( vec3 == check3 ) ;
  #ifdef QCLAB_OMP_OFFLOADING
    vec3 = v3 ;
    #pragma omp target data map(tofrom:vec3_[0:8])
    { X.apply_device( qclab::Op::NoTrans , 3 , vec3_ ) ; }
    EXPECT_TRUE( vec3 == check3 ) ;
  #endif

    X.setQubit( 2 ) ;
    vec3 = v3 ;
    X.apply( qclab::Op::NoTrans , 3 , vec3 ) ;
    check3 = { 5 , 3 , 7 , 2 , 1 , 4 , 3 , 8 } ;
    EXPECT_TRUE( vec3 == check3 ) ;
  #ifdef QCLAB_OMP_OFFLOADING
    vec3 = v3 ;
    #pragma omp target data map(tofrom:vec3_[0:8])
    { X.apply_device( qclab::Op::NoTrans , 3 , vec3_ ) ; }
    EXPECT_TRUE( vec3 == check3 ) ;
  #endif
  }

  // apply (Trans)
  {
    qclab::qgates::RotationY< T >  Y( 0 , R(0) , R(1) ) ;

    // nbQubits = 1
    auto vec1 = v1 ;
    Y.apply( qclab::Op::Trans , 1 , vec1 ) ;
    V check1 = { 5 , -3 } ;
    EXPECT_TRUE( vec1 == check1 ) ;
  #ifdef QCLAB_OMP_OFFLOADING
    vec1 = v1 ; T* vec1_ = vec1.data() ;
    #pragma omp target data map(tofrom:vec1_[0:2])
    { Y.apply_device( qclab::Op::Trans , 1 , vec1_ ) ; }
    EXPECT_TRUE( vec1 == check1 ) ;
  #endif

    // nbQubits = 2
    auto vec2 = v2 ;
    Y.apply( qclab::Op::Trans , 2 , vec2 ) ;
    V check2 = { 2 , 7 , -3 , -5 } ;
    EXPECT_TRUE( vec2 == check2 ) ;
  #ifdef QCLAB_OMP_OFFLOADING
    vec2 = v2 ; T* vec2_ = vec2.data() ;
    #pragma omp target data map(tofrom:vec2_[0:4])
    { Y.apply_device( qclab::Op::Trans , 2 , vec2_ ) ; }
    EXPECT_TRUE( vec2 == check2 ) ;
  #endif

    Y.setQubit( 1 ) ;
    vec2 = v2 ;
    Y.apply( qclab::Op::Trans , 2 , vec2 ) ;
    check2 = { 5 , -3 , 7 , -2 } ;
    EXPECT_TRUE( vec2 == check2 ) ;
  #ifdef QCLAB_OMP_OFFLOADING
    vec2 = v2 ;
    #pragma omp target data map(tofrom:vec2_[0:4])
    { Y.apply_device( qclab::Op::Trans , 2 , vec2_ ) ; }
    EXPECT_TRUE( vec2 == check2 ) ;
  #endif

    // nbQubits = 3
    auto vec3 = v3 ;
    Y.apply( qclab::Op::Trans , 3 , vec3 ) ;
    V check3 = { 2 , 7 , -3 , -5 , 8 , 3 , -4 , -1 } ;
    EXPECT_TRUE( vec3 == check3 ) ;
  #ifdef QCLAB_OMP_OFFLOADING
    vec3 = v3 ; T* vec3_ = vec3.data() ;
    #pragma omp target data map(tofrom:vec3_[0:8])
    { Y.apply_device( qclab::Op::Trans , 3 , vec3_ ) ; }
    EXPECT_TRUE( vec3 == check3 ) ;
  #endif

    Y.setQubit( 0 ) ;
    vec3 = v3 ;
    Y.apply( qclab::Op::Trans , 3 , vec3 ) ;
    check3 = { 4 , 1 , 8 , 3 , -3 , -5 , -2 , -7 } ;
    EXPECT_TRUE( vec3 == check3 ) ;
  #ifdef QCLAB_OMP_OFFLOADING
    vec3 = v3 ;
    #pragma omp target data map(tofrom:vec3_[0:8])
    { Y.apply_device( qclab::Op::Trans , 3 , vec3_ ) ; }
    EXPECT_TRUE( vec3 == check3 ) ;
  #endif

    Y.setQubit( 2 ) ;
    vec3 = v3 ;
    Y.apply( qclab::Op::Trans , 3 , vec3 ) ;
    check3 = { 5 , -3 , 7 , -2 , 1 , -4 , 3 , -8 } ;
    EXPECT_TRUE( vec3 == check3 ) ;
  #ifdef QCLAB_OMP_OFFLOADING
    vec3 = v3 ;
    #pragma omp target data map(tofrom:vec3_[0:8])
    { Y.apply_device( qclab::Op::Trans , 3 , vec3_ ) ; }
    EXPECT_TRUE( vec3 == check3 ) ;
  #endif
  }


  // apply (Left + NoTrans)
  {
    qclab::qgates::PauliX< T >  X( 0 ) ;

    // nbQubits = 1
    auto mat1 = I1 ;
    X.apply( qclab::Side::Left , qclab::Op::NoTrans , 1 , mat1 ) ;
    EXPECT_TRUE( mat1 == X.matrix() ) ;
    mat1 = M( 2 , 3 ,
              5 , 7 ) ;
    X.apply( qclab::Side::Left , qclab::Op::NoTrans , 1 , mat1 ) ;
    M check1( 3 , 2 ,
              7 , 5 ) ;
    EXPECT_TRUE( mat1 == check1 ) ;

    // nbQubits = 2
    auto mat2 = I2 ;
    X.apply( qclab::Side::Left , qclab::Op::NoTrans , 2 , mat2 ) ;
    EXPECT_TRUE( mat2 == qclab::dense::kron( X.matrix() , I1 ) ) ;

    X.setQubit( 1 ) ;
    mat2 = I2 ;
    X.apply( qclab::Side::Left , qclab::Op::NoTrans , 2 , mat2 ) ;
    EXPECT_TRUE( mat2 == qclab::dense::kron( I1 , X.matrix() ) ) ;

    // nbQubits = 3
    auto mat3 = I3 ;
    X.apply( qclab::Side::Left , qclab::Op::NoTrans , 3 , mat3 ) ;
    EXPECT_TRUE( mat3 == qclab::dense::kron( I1 ,
                           qclab::dense::kron( X.matrix() , I1 ) ) ) ;
  }

  // apply (Right + NoTrans)
  {
    qclab::qgates::PauliX< T >  X( 0 ) ;

    // nbQubits = 1
    auto mat1 = I1 ;
    X.apply( qclab::Side::Right , qclab::Op::NoTrans , 1 , mat1 ) ;
    EXPECT_TRUE( mat1 == X.matrix() ) ;
    mat1 = M( 2 , 3 ,
              5 , 7 ) ;
    X.apply( qclab::Side::Right , qclab::Op::NoTrans , 1 , mat1 ) ;
    M check1( 5 , 7 ,
              2 , 3 ) ;
    EXPECT_TRUE( mat1 == check1 ) ;

    // nbQubits = 2
    auto mat2 = I2 ;
    X.apply( qclab::Side::Right , qclab::Op::NoTrans , 2 , mat2 ) ;
    EXPECT_TRUE( mat2 == qclab::dense::kron( X.matrix() , I1 ) ) ;

    X.setQubit( 1 ) ;
    mat2 = I2 ;
    X.apply( qclab::Side::Right , qclab::Op::NoTrans , 2 , mat2 ) ;
    EXPECT_TRUE( mat2 == qclab::dense::kron( I1 , X.matrix() ) ) ;

    // nbQubits = 3
    auto mat3 = I3 ;
    X.apply( qclab::Side::Right , qclab::Op::NoTrans , 3 , mat3 ) ;
    EXPECT_TRUE( mat3 == qclab::dense::kron( I1 ,
                           qclab::dense::kron( X.matrix() , I1 ) ) ) ;
  }

  // apply (Left + Trans)
  {
    qclab::qgates::RotationY< T >  Y( 0 , R(0) , R(1) ) ;
    M Ytrans = qclab::dense::trans( Y.matrix() ) ;

    // nbQubits = 1
    auto mat1 = I1 ;
    Y.apply( qclab::Side::Left , qclab::Op::Trans , 1 , mat1 ) ;
    EXPECT_TRUE( mat1 == Ytrans ) ;
    mat1 = M( 2 , 3 ,
              5 , 7 ) ;
    Y.apply( qclab::Side::Left , qclab::Op::Trans , 1 , mat1 ) ;
    M check1( -3 , 2 ,
              -7 , 5 ) ;
    EXPECT_TRUE( mat1 == check1 ) ;

    // nbQubits = 2
    auto mat2 = I2 ;
    Y.apply( qclab::Side::Left , qclab::Op::Trans , 2 , mat2 ) ;
    EXPECT_TRUE( mat2 == qclab::dense::kron( Ytrans , I1 ) ) ;

    Y.setQubit( 1 ) ;
    mat2 = I2 ;
    Y.apply( qclab::Side::Left , qclab::Op::Trans , 2 , mat2 ) ;
    EXPECT_TRUE( mat2 == qclab::dense::kron( I1 , Ytrans ) ) ;

    // nbQubits = 3
    auto mat3 = I3 ;
    Y.apply( qclab::Side::Left , qclab::Op::Trans , 3 , mat3 ) ;
    EXPECT_TRUE( mat3 == qclab::dense::kron( I1 ,
                           qclab::dense::kron( Ytrans , I1 ) ) ) ;
  }

  // apply (Right + Trans)
  {
    qclab::qgates::RotationY< T >  Y( 0 , R(0) , R(1) ) ;
    M Ytrans = qclab::dense::trans( Y.matrix() ) ;

    // nbQubits = 1
    auto mat1 = I1 ;
    Y.apply( qclab::Side::Right , qclab::Op::Trans , 1 , mat1 ) ;
    EXPECT_TRUE( mat1 == Ytrans ) ;
    mat1 = M( 2 , 3 ,
              5 , 7 ) ;
    Y.apply( qclab::Side::Right , qclab::Op::Trans , 1 , mat1 ) ;
    M check1(  5 ,  7 ,
              -2 , -3 ) ;
    EXPECT_TRUE( mat1 == check1 ) ;

    // nbQubits = 2
    auto mat2 = I2 ;
    Y.apply( qclab::Side::Right , qclab::Op::Trans , 2 , mat2 ) ;
    EXPECT_TRUE( mat2 == qclab::dense::kron( Ytrans , I1 ) ) ;

    Y.setQubit( 1 ) ;
    mat2 = I2 ;
    Y.apply( qclab::Side::Right , qclab::Op::Trans , 2 , mat2 ) ;
    EXPECT_TRUE( mat2 == qclab::dense::kron( I1 , Ytrans ) ) ;

    // nbQubits = 3
    auto mat3 = I3 ;
    Y.apply( qclab::Side::Right , qclab::Op::Trans , 3 , mat3 ) ;
    EXPECT_TRUE( mat3 == qclab::dense::kron( I1 ,
                           qclab::dense::kron( Ytrans , I1 ) ) ) ;
  }

}